

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O3

void __thiscall
embree::SceneGraphFlattener::convertLightsAndCameras
          (SceneGraphFlattener *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *group,Ref<embree::SceneGraph::Node> *node,Transformations *spaces)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  undefined8 *puVar5;
  size_type *psVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  BBox1f time_range;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  Node *pNVar13;
  size_t sVar14;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar15;
  long lVar16;
  Ref<embree::SceneGraph::Node> *pRVar17;
  size_type sVar18;
  pointer pcVar19;
  _func_int **pp_Var20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  ulong uVar41;
  ulong uVar42;
  pointer pRVar43;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *this_00;
  byte bVar44;
  undefined1 uVar45;
  undefined4 uVar46;
  long *plVar47;
  ulong uVar48;
  void *pvVar49;
  AnimatedPerspectiveCameraNode *pAVar50;
  AnimatedLightNode *this_01;
  PerspectiveCameraNode *this_02;
  runtime_error *prVar51;
  byte bVar53;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  Ref<embree::SceneGraph::Node> *child;
  Ref<embree::SceneGraph::Node> *node_00;
  uint uVar57;
  int iVar58;
  uint uVar59;
  int iVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  cameras;
  Ref<embree::SceneGraph::PerspectiveCameraNode> cameraNode_1;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> cameraNode;
  float local_208;
  float local_1f8;
  float fStack_1f4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  void *local_1c8;
  ulong uStack_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [32];
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  local_188;
  Ref<embree::SceneGraph::PerspectiveCameraNode> local_170;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
  *local_150;
  SceneGraphFlattener *local_148;
  Ref<embree::SceneGraph::AnimatedPerspectiveCameraNode> local_140;
  undefined8 local_138;
  undefined8 uStack_130;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  string local_90;
  string local_70;
  string local_50;
  undefined7 uVar52;
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar68 [16];
  
  pNVar13 = node->ptr;
  if (pNVar13->hasLightOrCamera != true) {
    return;
  }
  local_148 = this;
  plVar47 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                   &SceneGraph::TransformNode::typeinfo,0);
  if (plVar47 == (long *)0x0) {
    plVar47 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::GroupNode::typeinfo,0);
    if (plVar47 != (long *)0x0) {
      (**(code **)(*plVar47 + 0x10))(plVar47);
      pRVar17 = (Ref<embree::SceneGraph::Node> *)plVar47[0xe];
      for (node_00 = (Ref<embree::SceneGraph::Node> *)plVar47[0xd]; node_00 != pRVar17;
          node_00 = node_00 + 1) {
        convertLightsAndCameras(local_148,group,node_00,spaces);
      }
      (**(code **)(*plVar47 + 0x18))(plVar47);
      return;
    }
    plVar47 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::AnimatedLightNode::typeinfo,0);
    if (plVar47 != (long *)0x0) {
      (**(code **)(*plVar47 + 0x10))(plVar47);
      if ((spaces->spaces).size_active == 1) {
        pAVar15 = (spaces->spaces).items;
        local_1e8._0_8_ = *(undefined8 *)&(pAVar15->l).vx.field_0;
        local_1e8._8_8_ = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 8);
        local_1d8._M_allocated_capacity = *(undefined8 *)&(pAVar15->l).vy.field_0;
        local_1d8._8_8_ = *(undefined8 *)((long)&(pAVar15->l).vy.field_0 + 8);
        local_1c8 = *(void **)&(pAVar15->l).vz.field_0;
        uStack_1c0 = *(undefined8 *)((long)&(pAVar15->l).vz.field_0 + 8);
        local_1b8 = (pAVar15->p).field_0.m128[0];
        fStack_1b4 = (pAVar15->p).field_0.m128[1];
        fStack_1b0 = (pAVar15->p).field_0.m128[2];
        fStack_1ac = (pAVar15->p).field_0.m128[3];
        (**(code **)(*plVar47 + 0x80))(&local_188,plVar47);
        local_1a8._0_8_ =
             local_188.
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if ((AnimatedPerspectiveCameraNode *)
            local_188.
            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
          (*(((PerspectiveCameraNode *)
             &(local_188.
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
            _vptr_RefCount[2])();
        }
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    *)group,(Ref<embree::SceneGraph::Node> *)local_1a8);
        if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ != (AnimatedPerspectiveCameraNode *)0x0
           ) {
          (**(code **)(*(long *)local_1a8._0_8_ + 0x18))();
        }
        if ((AnimatedPerspectiveCameraNode *)
            local_188.
            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
          (*(((PerspectiveCameraNode *)
             &(local_188.
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
            _vptr_RefCount[3])();
        }
        (**(code **)(*plVar47 + 0x18))(plVar47);
        return;
      }
      prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar51,"animated lights cannot get instantiated with a transform animation");
      __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar47 = (long *)__dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                                     &SceneGraph::LightNode::typeinfo,0);
    if (plVar47 != (long *)0x0) {
      (**(code **)(*plVar47 + 0x10))(plVar47);
      sVar18 = (spaces->spaces).size_active;
      if (sVar18 == 1) {
        pAVar15 = (spaces->spaces).items;
        local_1e8._0_8_ = *(undefined8 *)&(pAVar15->l).vx.field_0;
        local_1e8._8_8_ = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 8);
        local_1d8._M_allocated_capacity = *(undefined8 *)&(pAVar15->l).vy.field_0;
        local_1d8._8_8_ = *(size_type *)((long)&(pAVar15->l).vy.field_0 + 8);
        local_1c8 = *(void **)&(pAVar15->l).vz.field_0;
        uStack_1c0 = *(ulong *)((long)&(pAVar15->l).vz.field_0 + 8);
        local_1b8 = (pAVar15->p).field_0.m128[0];
        fStack_1b4 = (pAVar15->p).field_0.m128[1];
        fStack_1b0 = (pAVar15->p).field_0.m128[2];
        fStack_1ac = (pAVar15->p).field_0.m128[3];
        (**(code **)(*plVar47 + 0x80))(&local_188,plVar47);
        local_1a8._0_8_ =
             local_188.
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        if ((AnimatedPerspectiveCameraNode *)
            local_188.
            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
          (*(((PerspectiveCameraNode *)
             &(local_188.
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
            _vptr_RefCount[2])();
        }
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                    *)group,(Ref<embree::SceneGraph::Node> *)local_1a8);
        if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ != (AnimatedPerspectiveCameraNode *)0x0
           ) {
          (**(code **)(*(long *)local_1a8._0_8_ + 0x18))();
        }
        if ((AnimatedPerspectiveCameraNode *)
            local_188.
            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
          (*(((PerspectiveCameraNode *)
             &(local_188.
               super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
            _vptr_RefCount[3])();
        }
      }
      else {
        local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        std::
        vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
        ::vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                  *)local_1a8,sVar18,(allocator_type *)&local_1e8.field_1);
        if ((spaces->spaces).size_active != 0) {
          lVar55 = 0x30;
          uVar56 = 0;
          do {
            pAVar15 = (spaces->spaces).items;
            puVar5 = (undefined8 *)((long)pAVar15 + lVar55 + -0x30);
            local_1e8._0_8_ = *puVar5;
            local_1e8._8_8_ = puVar5[1];
            psVar6 = (size_type *)((long)pAVar15 + lVar55 + -0x20);
            local_1d8._M_allocated_capacity = *psVar6;
            local_1d8._8_8_ = psVar6[1];
            puVar5 = (undefined8 *)((long)pAVar15 + lVar55 + -0x10);
            local_1c8 = (void *)*puVar5;
            uStack_1c0 = puVar5[1];
            pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
            local_1b8 = *pfVar1;
            fStack_1b4 = pfVar1[1];
            fStack_1b0 = pfVar1[2];
            fStack_1ac = pfVar1[3];
            (**(code **)(*plVar47 + 0x80))(&local_188,plVar47,&local_1e8);
            uVar9 = local_1a8._0_8_;
            if (*(long **)(local_1a8._0_8_ + uVar56 * 8) != (long *)0x0) {
              (**(code **)(**(long **)(local_1a8._0_8_ + uVar56 * 8) + 0x18))();
            }
            *(pointer *)(uVar9 + uVar56 * 8) =
                 local_188.
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            uVar56 = uVar56 + 1;
            lVar55 = lVar55 + 0x40;
          } while (uVar56 < (spaces->spaces).size_active);
        }
        this_01 = (AnimatedLightNode *)operator_new(0x88);
        this_00 = local_150;
        SceneGraph::AnimatedLightNode::AnimatedLightNode
                  (this_01,(vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                            *)local_1a8,spaces->time_range);
        local_1e8._0_8_ = this_01;
        (*(this_01->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_01);
        std::
        vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
        ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                  (this_00,(Ref<embree::SceneGraph::Node> *)&local_1e8.field_1);
        if ((AnimatedLightNode *)local_1e8._0_8_ != (AnimatedLightNode *)0x0) {
          (**(code **)(*(long *)local_1e8._0_8_ + 0x18))();
        }
        std::
        vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
        ::~vector((vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                   *)local_1a8);
      }
      (**(code **)(*plVar47 + 0x18))(plVar47);
      return;
    }
    local_140.ptr =
         (AnimatedPerspectiveCameraNode *)
         __dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                        &SceneGraph::AnimatedPerspectiveCameraNode::typeinfo,0);
    if (local_140.ptr == (AnimatedPerspectiveCameraNode *)0x0) {
      local_170.ptr =
           (PerspectiveCameraNode *)
           __dynamic_cast(pNVar13,&SceneGraph::Node::typeinfo,
                          &SceneGraph::PerspectiveCameraNode::typeinfo,0);
      if ((local_170.ptr != (PerspectiveCameraNode *)0x0) &&
         ((*((local_170.ptr)->super_Node).super_RefCount._vptr_RefCount[2])(local_170.ptr),
         local_170.ptr != (PerspectiveCameraNode *)0x0)) {
        sVar18 = (spaces->spaces).size_active;
        if (sVar18 == 1) {
          pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xb0,0x10);
          pAVar15 = (spaces->spaces).items;
          local_1e8._0_8_ = *(undefined8 *)&(pAVar15->l).vx.field_0;
          local_1e8._8_8_ = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 8);
          local_1d8._M_allocated_capacity = *(undefined8 *)&(pAVar15->l).vy.field_0;
          local_1d8._8_8_ = *(size_type *)((long)&(pAVar15->l).vy.field_0 + 8);
          local_1c8 = *(void **)&(pAVar15->l).vz.field_0;
          uStack_1c0 = *(ulong *)((long)&(pAVar15->l).vz.field_0 + 8);
          local_1b8 = (pAVar15->p).field_0.m128[0];
          fStack_1b4 = (pAVar15->p).field_0.m128[1];
          fStack_1b0 = (pAVar15->p).field_0.m128[2];
          fStack_1ac = (pAVar15->p).field_0.m128[3];
          pcVar19 = ((local_170.ptr)->super_Node).name._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar19,
                     pcVar19 + ((local_170.ptr)->super_Node).name._M_string_length);
          makeUniqueID((string *)local_1a8,local_148,&local_70);
          SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                    ((PerspectiveCameraNode *)pAVar50,&local_170,
                     (AffineSpace3fa *)&local_1e8.field_1,(string *)local_1a8);
          local_188.
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar50;
          (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])
                    (pAVar50);
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      *)group,(Ref<embree::SceneGraph::Node> *)&local_188);
          if ((AnimatedPerspectiveCameraNode *)
              local_188.
              super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
            (*(((PerspectiveCameraNode *)
               &(local_188.
                 super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
              _vptr_RefCount[3])();
          }
          if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ !=
              (AnimatedPerspectiveCameraNode *)(local_1a8 + 0x10)) {
            operator_delete((void *)local_1a8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        else {
          std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::vector(&local_188,sVar18,(allocator_type *)&local_1e8.field_1);
          if ((spaces->spaces).size_active != 0) {
            lVar55 = 0x30;
            uVar56 = 0;
            local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                         *)group;
            do {
              this_02 = (PerspectiveCameraNode *)alignedMalloc(0xb0,0x10);
              pAVar15 = (spaces->spaces).items;
              puVar5 = (undefined8 *)((long)pAVar15 + lVar55 + -0x30);
              local_1e8._0_8_ = *puVar5;
              local_1e8._8_8_ = puVar5[1];
              psVar6 = (size_type *)((long)pAVar15 + lVar55 + -0x20);
              local_1d8._M_allocated_capacity = *psVar6;
              local_1d8._8_8_ = psVar6[1];
              puVar5 = (undefined8 *)((long)pAVar15 + lVar55 + -0x10);
              local_1c8 = (void *)*puVar5;
              uStack_1c0 = puVar5[1];
              pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
              local_1b8 = *pfVar1;
              fStack_1b4 = pfVar1[1];
              fStack_1b0 = pfVar1[2];
              fStack_1ac = pfVar1[3];
              local_1a8._0_8_ = (AnimatedPerspectiveCameraNode *)(local_1a8 + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
              SceneGraph::PerspectiveCameraNode::PerspectiveCameraNode
                        (this_02,&local_170,(AffineSpace3fa *)&local_1e8.field_1,(string *)local_1a8
                        );
              pRVar43 = local_188.
                        super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              (*(this_02->super_Node).super_RefCount._vptr_RefCount[2])(this_02);
              pp_Var20 = (&(((PerspectiveCameraNode *)&pRVar43->ptr)->super_Node).super_RefCount.
                           _vptr_RefCount)[uVar56];
              if (pp_Var20 != (_func_int **)0x0) {
                (**(code **)(*pp_Var20 + 0x18))();
              }
              (&(((PerspectiveCameraNode *)&pRVar43->ptr)->super_Node).super_RefCount._vptr_RefCount
              )[uVar56] = (_func_int **)this_02;
              if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ !=
                  (AnimatedPerspectiveCameraNode *)(local_1a8 + 0x10)) {
                operator_delete((void *)local_1a8._0_8_);
              }
              uVar56 = uVar56 + 1;
              lVar55 = lVar55 + 0x40;
              group = (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                       *)local_150;
            } while (uVar56 < (spaces->spaces).size_active);
          }
          pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xd0,0x10);
          time_range = spaces->time_range;
          pcVar19 = ((local_170.ptr)->super_Node).name._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar19,
                     pcVar19 + ((local_170.ptr)->super_Node).name._M_string_length);
          makeUniqueID((string *)&local_1e8.field_1,local_148,&local_90);
          SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                    (pAVar50,&local_188,time_range,(string *)&local_1e8.field_1);
          local_1a8._0_8_ = pAVar50;
          (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])
                    (pAVar50);
          std::
          vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
          ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                    ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                      *)group,(Ref<embree::SceneGraph::Node> *)local_1a8);
          if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ !=
              (AnimatedPerspectiveCameraNode *)0x0) {
            (**(code **)(*(long *)local_1a8._0_8_ + 0x18))();
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._0_8_ != &local_1d8) {
            operator_delete((void *)local_1e8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          std::
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ::~vector(&local_188);
        }
        if (local_170.ptr != (PerspectiveCameraNode *)0x0) {
          (*((local_170.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
        }
      }
    }
    else {
      (*((local_140.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])
                (local_140.ptr);
      if ((spaces->spaces).size_active != 1) {
        prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (prVar51,"animated cameras cannot get instantiated with a transform animation");
        __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pAVar50 = (AnimatedPerspectiveCameraNode *)alignedMalloc(0xd0,0x10);
      pAVar15 = (spaces->spaces).items;
      local_1e8._0_8_ = *(undefined8 *)&(pAVar15->l).vx.field_0;
      local_1e8._8_8_ = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 8);
      local_1d8._M_allocated_capacity = *(undefined8 *)&(pAVar15->l).vy.field_0;
      local_1d8._8_8_ = *(size_type *)((long)&(pAVar15->l).vy.field_0 + 8);
      local_1c8 = *(void **)&(pAVar15->l).vz.field_0;
      uStack_1c0 = *(ulong *)((long)&(pAVar15->l).vz.field_0 + 8);
      local_1b8 = (pAVar15->p).field_0.m128[0];
      fStack_1b4 = (pAVar15->p).field_0.m128[1];
      fStack_1b0 = (pAVar15->p).field_0.m128[2];
      fStack_1ac = (pAVar15->p).field_0.m128[3];
      pcVar19 = ((local_140.ptr)->super_PerspectiveCameraNode).super_Node.name._M_dataplus._M_p;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar19,
                 pcVar19 + ((local_140.ptr)->super_PerspectiveCameraNode).super_Node.name.
                           _M_string_length);
      makeUniqueID((string *)local_1a8,local_148,&local_50);
      SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
                (pAVar50,&local_140,(AffineSpace3fa *)&local_1e8.field_1,(string *)local_1a8);
      local_188.
      super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pAVar50;
      (*(pAVar50->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[2])(pAVar50)
      ;
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
      ::emplace_back<embree::Ref<embree::SceneGraph::Node>>
                ((vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                  *)group,(Ref<embree::SceneGraph::Node> *)&local_188);
      if ((AnimatedPerspectiveCameraNode *)
          local_188.
          super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (AnimatedPerspectiveCameraNode *)0x0) {
        (*(((PerspectiveCameraNode *)
           &(local_188.
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->ptr)->super_Node).super_RefCount.
          _vptr_RefCount[3])();
      }
      if ((AnimatedPerspectiveCameraNode *)local_1a8._0_8_ !=
          (AnimatedPerspectiveCameraNode *)(local_1a8 + 0x10)) {
        operator_delete((void *)local_1a8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if (local_140.ptr == (AnimatedPerspectiveCameraNode *)0x0) {
      return;
    }
    (*((local_140.ptr)->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount[3])();
    return;
  }
  (**(code **)(*plVar47 + 0x10))(plVar47);
  sVar14 = (spaces->spaces).size_active;
  if (sVar14 == 1) {
    fVar61 = (spaces->time_range).lower;
    fVar63 = (spaces->time_range).upper;
    fVar73 = (float)plVar47[0xd];
    fVar99 = (float)((ulong)plVar47[0xd] >> 0x20);
    uVar57 = -(uint)(fVar61 < fVar73);
    uVar59 = -(uint)(fVar63 < fVar99);
    local_1e8._0_8_ =
         CONCAT44(~uVar59 & (uint)fVar99,~uVar57 & (uint)fVar61) |
         CONCAT44((uint)fVar63 & uVar59,(uint)fVar73 & uVar57);
    sVar14 = plVar47[0xf];
    local_1d8._M_allocated_capacity = 0;
    local_1d8._8_8_ = 0;
    local_1c8 = (void *)0x0;
    if (sVar14 == 0) {
      uStack_1c0 = (ulong)uStack_1c0._1_7_ << 8;
      local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                   *)group;
    }
    else {
      local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                   *)group;
      local_1c8 = alignedMalloc(sVar14 << 6,0x10);
      uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
      local_1d8._M_allocated_capacity = sVar14;
      local_1d8._8_8_ = sVar14;
      if (plVar47[0xf] != 0) {
        lVar55 = 0x30;
        uVar54 = 0;
        uVar56 = extraout_RDX;
        do {
          uVar41 = uStack_1c0;
          uVar57 = (uint)uVar56;
          pAVar15 = (spaces->spaces).items;
          lVar16 = plVar47[0x11];
          bVar12 = spaces->quaternion;
          uVar52 = (undefined7)((ulong)local_1c8 >> 8);
          uVar48 = CONCAT71(uVar52,bVar12);
          bVar44 = *(byte *)(plVar47 + 0x12);
          uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
          uVar42 = uStack_1c0;
          fVar61 = (pAVar15->l).vx.field_0.m128[0];
          uVar9 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + 4);
          fVar63 = (float)((ulong)uVar9 >> 0x20);
          local_208 = (float)uVar9;
          uStack_1c0._1_7_ = SUB87(uVar41,1);
          if (((((fVar61 != 1.0) || (NAN(fVar61))) || (local_208 != 0.0)) ||
              ((NAN(local_208) || (fVar63 != 0.0)))) || (NAN(fVar63))) {
LAB_0015c167:
            uVar9 = *(undefined8 *)(lVar16 + -0x30 + lVar55);
            fVar73 = (float)uVar9;
            fVar99 = (float)((ulong)uVar9 >> 0x20);
            iVar58 = -(uint)(fVar73 != 1.0);
            iVar60 = -(uint)(fVar99 != 0.0);
            auVar65._4_4_ = iVar60;
            auVar65._0_4_ = iVar58;
            auVar65._8_4_ = iVar60;
            auVar65._12_4_ = iVar60;
            auVar64._8_8_ = auVar65._8_8_;
            auVar64._4_4_ = iVar58;
            auVar64._0_4_ = iVar58;
            uVar57 = movmskpd(uVar57,auVar64);
            fVar61 = *(float *)(lVar16 + -0x28 + lVar55);
            if (((uVar57 & 1) == 0) &&
               (((bVar53 = (byte)uVar57 >> 1, bVar53 == 0 && (fVar61 == 0.0)) && (!NAN(fVar61))))) {
              pfVar1 = (float *)(lVar16 + -0x24 + lVar55);
              auVar32._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar32._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar32._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar32._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar32);
              if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                 (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                pfVar1 = (float *)(lVar16 + -0x14 + lVar55);
                auVar33._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar33._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar33._8_4_ = -(uint)(pfVar1[2] != 0.0);
                auVar33._12_4_ = -(uint)(pfVar1[3] != 1.0);
                uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar33);
                if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                   (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                  pfVar1 = (float *)(lVar16 + -4 + lVar55);
                  auVar34._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar34._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar34._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar34._12_4_ = -(uint)(pfVar1[3] != 0.0);
                  uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar34);
                  if ((((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                       ((uVar57 & 4) == 0)) &&
                      (bVar53 = ((byte)uVar57 & 8) >> 3,
                      uVar56 = (ulong)CONCAT31((int3)(uVar57 >> 8),bVar53), bVar53 == 0)) &&
                     ((bVar44 == 0 ||
                      ((fVar62 = *(float *)(lVar16 + 0xc + lVar55), fVar62 == 1.0 && (!NAN(fVar62)))
                      )))) {
                    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar12);
                    fVar62 = (pAVar15->l).vx.field_0.m128[0];
                    local_208 = (pAVar15->l).vx.field_0.m128[1];
                    fVar63 = (pAVar15->l).vx.field_0.m128[2];
                    fVar99 = (pAVar15->l).vx.field_0.m128[3];
                    fVar102 = (pAVar15->l).vy.field_0.m128[0];
                    fVar84 = (pAVar15->l).vy.field_0.m128[1];
                    fVar93 = (pAVar15->l).vy.field_0.m128[2];
                    fVar95 = (pAVar15->l).vy.field_0.m128[3];
                    fVar61 = (pAVar15->l).vz.field_0.m128[0];
                    fVar73 = (pAVar15->l).vz.field_0.m128[1];
                    fVar70 = (pAVar15->l).vz.field_0.m128[2];
                    fVar80 = (pAVar15->l).vz.field_0.m128[3];
                    fVar86 = (pAVar15->p).field_0.m128[0];
                    fVar100 = (pAVar15->p).field_0.m128[1];
                    fVar101 = (pAVar15->p).field_0.m128[2];
                    fVar79 = (pAVar15->p).field_0.m128[3];
                    goto LAB_0015c8c0;
                  }
                }
              }
            }
            uVar56 = uVar48 & 0xffffffff;
            bVar53 = (byte)uVar56 | bVar44;
            uVar56 = CONCAT71((int7)(uVar56 >> 8),bVar53);
            uStack_1c0 = uVar42;
            if (bVar53 == 0) {
              fVar101 = (pAVar15->l).vx.field_0.m128[0];
              fVar103 = (pAVar15->l).vx.field_0.m128[1];
              fVar109 = (pAVar15->l).vx.field_0.m128[2];
              fVar112 = (pAVar15->l).vx.field_0.m128[3];
              fVar71 = (pAVar15->l).vy.field_0.m128[0];
              fVar72 = (pAVar15->l).vy.field_0.m128[1];
              fVar74 = (pAVar15->l).vy.field_0.m128[2];
              fVar105 = (pAVar15->l).vy.field_0.m128[3];
              fVar75 = (pAVar15->l).vz.field_0.m128[0];
              fVar76 = (pAVar15->l).vz.field_0.m128[1];
              fVar110 = (pAVar15->l).vz.field_0.m128[2];
              fVar77 = (pAVar15->l).vz.field_0.m128[3];
              fVar62 = fVar73 * fVar101 + fVar99 * fVar71 + fVar61 * fVar75;
              local_208 = fVar73 * fVar103 + fVar99 * fVar72 + fVar61 * fVar76;
              fVar63 = fVar73 * fVar109 + fVar99 * fVar74 + fVar61 * fVar110;
              fVar99 = fVar73 * fVar112 + fVar99 * fVar105 + fVar61 * fVar77;
              fVar61 = *(float *)(lVar16 + -0x20 + lVar55);
              fVar73 = *(float *)(lVar16 + -0x1c + lVar55);
              fVar95 = *(float *)(lVar16 + -0x18 + lVar55);
              fVar80 = *(float *)(lVar16 + -0x10 + lVar55);
              fVar102 = fVar61 * fVar101 + fVar73 * fVar71 + fVar95 * fVar75;
              fVar84 = fVar61 * fVar103 + fVar73 * fVar72 + fVar95 * fVar76;
              fVar93 = fVar61 * fVar109 + fVar73 * fVar74 + fVar95 * fVar110;
              fVar95 = fVar61 * fVar112 + fVar73 * fVar105 + fVar95 * fVar77;
              fVar86 = *(float *)(lVar16 + -0xc + lVar55);
              fVar100 = *(float *)(lVar16 + -8 + lVar55);
              fVar61 = fVar80 * fVar101 + fVar86 * fVar71 + fVar100 * fVar75;
              fVar73 = fVar80 * fVar103 + fVar86 * fVar72 + fVar100 * fVar76;
              fVar70 = fVar80 * fVar109 + fVar86 * fVar74 + fVar100 * fVar110;
              fVar80 = fVar80 * fVar112 + fVar86 * fVar105 + fVar100 * fVar77;
              fVar79 = *(float *)(lVar16 + lVar55);
              fVar7 = *(float *)(lVar16 + 4 + lVar55);
              fVar8 = *(float *)(lVar16 + 8 + lVar55);
              fVar86 = fVar79 * fVar101 + fVar7 * fVar71 + fVar8 * fVar75 +
                       (pAVar15->p).field_0.m128[0];
              fVar100 = fVar79 * fVar103 + fVar7 * fVar72 + fVar8 * fVar76 +
                        (pAVar15->p).field_0.m128[1];
              fVar101 = fVar79 * fVar109 + fVar7 * fVar74 + fVar8 * fVar110 +
                        (pAVar15->p).field_0.m128[2];
              fVar79 = fVar79 * fVar112 + fVar7 * fVar105 + fVar8 * fVar77 +
                       (pAVar15->p).field_0.m128[3];
            }
            else {
              uVar48 = uVar48 & 0xffffffff;
              bVar53 = (byte)uVar48 & bVar44;
              uVar56 = CONCAT71((int7)(uVar48 >> 8),bVar53);
              if (bVar53 == 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                           ,0x67);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                std::ostream::put(-0x38);
                std::ostream::flush();
                fVar61 = (pAVar15->p).field_0.m128[3];
                fVar63 = (pAVar15->l).vx.field_0.m128[3];
                fVar73 = (pAVar15->l).vy.field_0.m128[3];
                fVar99 = (pAVar15->l).vz.field_0.m128[3];
                aVar10 = (pAVar15->l).vx.field_0.field_1;
                fVar62 = (pAVar15->l).vy.field_0.m128[0];
                fVar102 = (pAVar15->l).vy.field_0.m128[1];
                fVar84 = (pAVar15->l).vz.field_0.m128[0];
                fVar93 = (pAVar15->l).vz.field_0.m128[1];
                fVar95 = (pAVar15->l).vz.field_0.m128[2];
                fVar103 = fVar63 * fVar73 + fVar61 * fVar99;
                fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                fVar86 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                fVar100 = fVar61 * fVar61 - fVar63 * fVar63;
                fVar101 = fVar73 * fVar73 + fVar100 + -fVar99 * fVar99;
                fVar112 = fVar63 * fVar99 - fVar61 * fVar73;
                fVar70 = fVar61 * fVar73 + fVar63 * fVar99;
                fVar109 = fVar73 * fVar99 + fVar61 * fVar63;
                fVar61 = fVar73 * fVar99 - fVar61 * fVar63;
                fVar79 = (pAVar15->p).field_0.m128[0];
                fVar7 = (pAVar15->p).field_0.m128[1];
                fVar8 = (pAVar15->p).field_0.m128[2];
                fVar103 = fVar103 + fVar103;
                fVar112 = fVar112 + fVar112;
                fVar80 = fVar80 + fVar80;
                fVar109 = fVar109 + fVar109;
                fVar70 = fVar70 + fVar70;
                fVar61 = fVar61 + fVar61;
                fVar63 = fVar99 * fVar99 + fVar100 + -fVar73 * fVar73;
                fVar87 = fVar86 * 1.0 + fVar103 * 0.0 + fVar112 * 0.0;
                fVar89 = fVar86 * 0.0 + fVar103 * 1.0 + fVar112 * 0.0;
                fVar91 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 1.0;
                fVar94 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 0.0;
                fVar81 = fVar80 * 1.0 + fVar101 * 0.0 + fVar109 * 0.0;
                fVar82 = fVar80 * 0.0 + fVar101 * 1.0 + fVar109 * 0.0;
                fVar83 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 1.0;
                fVar85 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 0.0;
                fVar86 = fVar70 * 1.0 + fVar61 * 0.0 + fVar63 * 0.0;
                fVar100 = fVar70 * 0.0 + fVar61 * 1.0 + fVar63 * 0.0;
                fVar101 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 1.0;
                fVar71 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 0.0;
                local_1f8 = aVar10.y;
                fStack_1f4 = aVar10.z;
                local_208 = aVar10.x;
                fVar104 = local_208 * fVar87 + fVar81 * 0.0 + fVar86 * 0.0;
                fVar106 = local_208 * fVar89 + fVar82 * 0.0 + fVar100 * 0.0;
                fVar107 = local_208 * fVar91 + fVar83 * 0.0 + fVar101 * 0.0;
                fVar108 = local_208 * fVar94 + fVar85 * 0.0 + fVar71 * 0.0;
                fVar103 = fVar62 * fVar87 + fVar102 * fVar81 + fVar86 * 0.0;
                fVar109 = fVar62 * fVar89 + fVar102 * fVar82 + fVar100 * 0.0;
                fVar112 = fVar62 * fVar91 + fVar102 * fVar83 + fVar101 * 0.0;
                fVar72 = fVar62 * fVar94 + fVar102 * fVar85 + fVar71 * 0.0;
                local_168 = fVar84 * fVar87 + fVar93 * fVar81 + fVar95 * fVar86;
                fStack_164 = fVar84 * fVar89 + fVar93 * fVar82 + fVar95 * fVar100;
                fStack_160 = fVar84 * fVar91 + fVar93 * fVar83 + fVar95 * fVar101;
                fStack_15c = fVar84 * fVar94 + fVar93 * fVar85 + fVar95 * fVar71;
                fVar61 = *(float *)(lVar16 + 0xc + lVar55);
                fVar63 = *(float *)(lVar16 + -0x24 + lVar55);
                fVar73 = *(float *)(lVar16 + -0x14 + lVar55);
                fVar99 = *(float *)(lVar16 + -4 + lVar55);
                fVar105 = fVar63 * fVar73 + fVar61 * fVar99;
                fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                fVar74 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                fVar102 = fVar61 * fVar61 - fVar63 * fVar63;
                fVar111 = fVar73 * fVar73 + fVar102 + -fVar99 * fVar99;
                fVar110 = fVar63 * fVar99 - fVar61 * fVar73;
                fVar77 = fVar61 * fVar73 + fVar63 * fVar99;
                fVar113 = fVar73 * fVar99 + fVar61 * fVar63;
                fVar70 = fVar73 * fVar99 - fVar61 * fVar63;
                pfVar2 = (float *)(lVar16 + -0x30 + lVar55);
                fVar61 = *pfVar2;
                pfVar3 = (float *)(lVar16 + -0x20 + lVar55);
                fVar63 = *pfVar3;
                fVar62 = pfVar3[1];
                fVar96 = fVar99 * fVar99 + fVar102 + -fVar73 * fVar73;
                pfVar1 = (float *)(lVar16 + -0x10 + lVar55);
                fVar73 = *pfVar1;
                fVar99 = pfVar1[1];
                fVar102 = pfVar1[2];
                fVar105 = fVar105 + fVar105;
                fVar110 = fVar110 + fVar110;
                pfVar1 = (float *)(lVar16 + lVar55);
                fVar84 = *pfVar1;
                fVar93 = pfVar1[1];
                fVar95 = pfVar1[2];
                fVar75 = fVar74 * 1.0 + fVar105 * 0.0 + fVar110 * 0.0;
                fVar76 = fVar74 * 0.0 + fVar105 * 1.0 + fVar110 * 0.0;
                fVar110 = fVar74 * 0.0 + fVar105 * 0.0 + fVar110 * 1.0;
                fVar80 = fVar80 + fVar80;
                fVar113 = fVar113 + fVar113;
                fVar77 = fVar77 + fVar77;
                fVar70 = fVar70 + fVar70;
                fVar74 = fVar80 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                fVar105 = fVar80 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                fVar80 = fVar80 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                fVar111 = fVar77 * 1.0 + fVar70 * 0.0 + fVar96 * 0.0;
                fVar113 = fVar77 * 0.0 + fVar70 * 1.0 + fVar96 * 0.0;
                fVar70 = fVar77 * 0.0 + fVar70 * 0.0 + fVar96 * 1.0;
                fVar88 = fVar61 * fVar75 + fVar74 * 0.0 + fVar111 * 0.0;
                fVar90 = fVar61 * fVar76 + fVar105 * 0.0 + fVar113 * 0.0;
                fVar92 = fVar61 * fVar110 + fVar80 * 0.0 + fVar70 * 0.0;
                fVar77 = fVar63 * fVar75 + fVar62 * fVar74 + fVar111 * 0.0;
                fVar96 = fVar63 * fVar76 + fVar62 * fVar105 + fVar113 * 0.0;
                fVar78 = fVar63 * fVar110 + fVar62 * fVar80 + fVar70 * 0.0;
                fVar97 = fVar73 * fVar75 + fVar99 * fVar74 + fVar102 * fVar111;
                fVar98 = fVar73 * fVar76 + fVar99 * fVar105 + fVar102 * fVar113;
                fVar99 = fVar73 * fVar110 + fVar99 * fVar80 + fVar102 * fVar70;
                fVar102 = fVar84 * fVar75 + fVar93 * fVar74 + fVar95 * fVar111 + pfVar2[1] + 0.0;
                fVar74 = fVar84 * fVar76 + fVar93 * fVar105 + fVar95 * fVar113 + pfVar2[2] + 0.0;
                fVar84 = fVar84 * fVar110 + fVar93 * fVar80 + fVar95 * fVar70 + pfVar3[2] + 0.0;
                fVar62 = fVar88 * fVar104 + fVar90 * fVar103 + fVar92 * local_168;
                local_208 = fVar88 * fVar106 + fVar90 * fVar109 + fVar92 * fStack_164;
                fVar63 = fVar88 * fVar107 + fVar90 * fVar112 + fVar92 * fStack_160;
                fVar61 = fVar97 * fVar104 + fVar98 * fVar103 + fVar99 * local_168;
                fVar73 = fVar97 * fVar106 + fVar98 * fVar109 + fVar99 * fStack_164;
                fVar70 = fVar97 * fVar107 + fVar98 * fVar112 + fVar99 * fStack_160;
                uVar56 = extraout_RDX_00;
                fVar80 = fVar97 * fVar108 + fVar98 * fVar72 + fVar99 * fStack_15c;
                fVar99 = fVar88 * fVar108 + fVar90 * fVar72 + fVar92 * fStack_15c;
                fVar86 = fVar102 * fVar104 + fVar74 * fVar103 + fVar84 * local_168 +
                         fVar79 * fVar87 + fVar7 * fVar81 + fVar8 * fVar86 + local_1f8 + 0.0;
                fVar100 = fVar102 * fVar106 + fVar74 * fVar109 + fVar84 * fStack_164 +
                          fVar79 * fVar89 + fVar7 * fVar82 + fVar8 * fVar100 + fStack_1f4 + 0.0;
                fVar101 = fVar102 * fVar107 + fVar74 * fVar112 + fVar84 * fStack_160 +
                          fVar79 * fVar91 + fVar7 * fVar83 + fVar8 * fVar101 +
                          (pAVar15->l).vy.field_0.m128[2] + 0.0;
                fVar79 = fVar102 * fVar108 + fVar74 * fVar72 + fVar84 * fStack_15c +
                         fVar79 * fVar94 + fVar7 * fVar85 + fVar8 * fVar71 + 0.0;
                fVar102 = fVar77 * fVar104 + fVar96 * fVar103 + fVar78 * local_168;
                fVar84 = fVar77 * fVar106 + fVar96 * fVar109 + fVar78 * fStack_164;
                fVar93 = fVar77 * fVar107 + fVar96 * fVar112 + fVar78 * fStack_160;
                fVar95 = fVar77 * fVar108 + fVar96 * fVar72 + fVar78 * fStack_15c;
              }
              else {
                bVar44 = bVar12 ^ 1U | bVar44;
                if (bVar44 == 0) {
                  local_f8 = ZEXT416((uint)(pAVar15->p).field_0.m128[3]);
                  local_d8 = ZEXT416((uint)(pAVar15->l).vx.field_0.m128[3]);
                  local_c8 = ZEXT416((uint)(pAVar15->l).vy.field_0.m128[3]);
                  local_108 = ZEXT416((uint)(pAVar15->l).vz.field_0.m128[3]);
                  local_128 = (pAVar15->l).vy.field_0.m128[0];
                  fStack_124 = (pAVar15->l).vy.field_0.m128[1];
                  fStack_e0 = (pAVar15->l).vy.field_0.m128[2];
                  fStack_11c = (pAVar15->l).vy.field_0.m128[3];
                  local_118 = (pAVar15->l).vz.field_0.m128[0];
                  fStack_114 = (pAVar15->l).vz.field_0.m128[1];
                  fStack_110 = (pAVar15->l).vz.field_0.m128[2];
                  fStack_10c = (pAVar15->l).vz.field_0.m128[3];
                  local_a8 = (pAVar15->l).vx.field_0.m128[0];
                  fStack_9c = (pAVar15->l).vx.field_0.m128[1];
                  pfVar1 = (float *)(lVar16 + -0x30 + lVar55);
                  fVar61 = *pfVar1;
                  fVar73 = pfVar1[1];
                  fVar99 = pfVar1[2];
                  pfVar1 = (float *)(lVar16 + -0x20 + lVar55);
                  fVar102 = *pfVar1;
                  fVar84 = pfVar1[1];
                  fVar93 = pfVar1[2];
                  puVar5 = (undefined8 *)(lVar16 + -0x10 + lVar55);
                  local_138 = *puVar5;
                  uStack_130 = puVar5[1];
                  pfVar1 = (float *)(lVar16 + lVar55);
                  fVar95 = *pfVar1;
                  fVar70 = pfVar1[1];
                  fVar80 = pfVar1[2];
                  fVar62 = fVar61 * local_a8 + fVar73 * local_128 + fVar99 * local_118;
                  fVar86 = fVar61 * 0.0 + fVar73 * fStack_124 + fVar99 * fStack_114;
                  fVar61 = fVar61 * 0.0 + fVar73 * 0.0 + fVar99 * fStack_110;
                  local_168 = fVar102 * local_a8 + fVar84 * local_128 + fVar93 * local_118;
                  fStack_164 = fVar102 * 0.0 + fVar84 * fStack_124 + fVar93 * fStack_114;
                  fStack_160 = fVar102 * 0.0 + fVar84 * 0.0 + fVar93 * fStack_110;
                  fStack_15c = fVar102 * fStack_9c + fVar84 * fStack_11c + fVar93 * fStack_10c;
                  fStack_120 = 0.0;
                  fStack_a4 = 0.0;
                  fStack_a0 = 0.0;
                  local_b8._0_4_ =
                       fVar95 * local_a8 + fVar70 * local_128 + fVar80 * local_118 +
                       (pAVar15->p).field_0.m128[0];
                  local_b8._4_4_ =
                       fVar95 * 0.0 + fVar70 * fStack_124 + fVar80 * fStack_114 +
                       (pAVar15->p).field_0.m128[1];
                  fStack_b0 = fVar95 * 0.0 + fVar70 * 0.0 + fVar80 * fStack_110 +
                              (pAVar15->p).field_0.m128[2];
                  register0x0000128c =
                       fVar95 * fStack_9c + fVar70 * fStack_11c + fVar80 * fStack_10c +
                       (pAVar15->p).field_0.m128[3];
                  local_e8 = local_128;
                  fStack_e4 = fStack_124;
                  fStack_dc = fStack_11c;
                  if (((fVar86 != 0.0) || (NAN(fVar86))) ||
                     ((fVar61 != 0.0 ||
                      (((NAN(fVar61) || (fStack_160 != 0.0)) || (NAN(fStack_160))))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                               ,0x61);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar56 = extraout_RDX_02;
                  }
                  fVar61 = local_a8 * (float)local_138 +
                           local_128 * local_138._4_4_ + local_118 * (float)uStack_130;
                  fVar73 = fStack_a4 * (float)local_138 +
                           fStack_124 * local_138._4_4_ + fStack_114 * (float)uStack_130;
                  fVar70 = fStack_a0 * (float)local_138 +
                           fStack_120 * local_138._4_4_ + fStack_110 * (float)uStack_130;
                  uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                  fVar80 = (float)local_108._0_4_;
                  fVar99 = (float)local_d8._0_4_;
                  fVar86 = (float)local_b8._0_4_;
                  fVar100 = (float)local_b8._4_4_;
                  fVar101 = fStack_b0;
                  fVar79 = (float)local_f8._0_4_;
                  fVar102 = local_168;
                  fVar84 = fStack_164;
                  fVar93 = fStack_e0;
                  fVar95 = (float)local_c8._0_4_;
                }
                else {
                  if (((local_208 != 0.0) || (NAN(local_208))) ||
                     ((fVar63 != 0.0 ||
                      ((NAN(fVar63) ||
                       (uVar9 = *(undefined8 *)&(pAVar15->l).vz.field_0,
                       auVar24._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0),
                       auVar24._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0),
                       auVar24._8_4_ = -(uint)((float)uVar9 != 0.0),
                       auVar24._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                       uVar46 = movmskps((int)CONCAT71(uVar52,bVar44),auVar24), (char)uVar46 != '\0'
                       )))))) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                               ,0x83);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                    std::ostream::put(-0x38);
                    std::ostream::flush();
                    uVar56 = extraout_RDX_01;
                  }
                  pfVar2 = (float *)(lVar16 + -0x30 + lVar55);
                  pfVar3 = (float *)(lVar16 + -0x20 + lVar55);
                  pfVar4 = (float *)(lVar16 + -0x10 + lVar55);
                  fVar61 = *pfVar4;
                  fVar73 = pfVar4[1];
                  pfVar1 = (float *)(lVar16 + lVar55);
                  uVar9 = *(undefined8 *)&(pAVar15->p).field_0;
                  fVar62 = (pAVar15->l).vx.field_0.m128[0] * *pfVar2;
                  local_208 = pfVar2[1] + (float)uVar9;
                  fVar63 = pfVar2[2] + (float)((ulong)uVar9 >> 0x20);
                  fVar70 = pfVar4[2] * (pAVar15->l).vz.field_0.m128[2];
                  uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                  fVar80 = pfVar4[3];
                  fVar99 = pfVar2[3];
                  fVar86 = *pfVar1;
                  fVar100 = pfVar1[1];
                  fVar101 = pfVar1[2];
                  fVar79 = pfVar1[3];
                  fVar102 = *pfVar3;
                  fVar84 = pfVar3[1] * (pAVar15->l).vy.field_0.m128[1];
                  fVar93 = pfVar3[2] + (pAVar15->p).field_0.m128[2];
                  fVar95 = pfVar3[3];
                }
              }
            }
          }
          else {
            auVar21._4_4_ = -(uint)((pAVar15->l).vy.field_0.m128[0] != 0.0);
            auVar21._0_4_ = -(uint)((pAVar15->l).vx.field_0.m128[3] != 0.0);
            auVar21._8_4_ = -(uint)((pAVar15->l).vy.field_0.m128[1] != 1.0);
            auVar21._12_4_ = -(uint)((pAVar15->l).vy.field_0.m128[2] != 0.0);
            uVar57 = movmskps(uVar57,auVar21);
            if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) ||
               (((uVar57 & 4) != 0 ||
                (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53),
                bVar53 != 0)))) goto LAB_0015c167;
            auVar22._4_4_ = -(uint)((pAVar15->l).vz.field_0.m128[0] != 0.0);
            auVar22._0_4_ = -(uint)((pAVar15->l).vy.field_0.m128[3] != 0.0);
            auVar22._8_4_ = -(uint)((pAVar15->l).vz.field_0.m128[1] != 0.0);
            auVar22._12_4_ = -(uint)((pAVar15->l).vz.field_0.m128[2] != 1.0);
            uVar57 = movmskps(uVar57,auVar22);
            if (((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0)) ||
               (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53),
               bVar53 != 0)) goto LAB_0015c167;
            auVar23._4_4_ = -(uint)((pAVar15->p).field_0.m128[0] != 0.0);
            auVar23._0_4_ = -(uint)((pAVar15->l).vz.field_0.m128[3] != 0.0);
            auVar23._8_4_ = -(uint)((pAVar15->p).field_0.m128[1] != 0.0);
            auVar23._12_4_ = -(uint)((pAVar15->p).field_0.m128[2] != 0.0);
            uVar57 = movmskps(uVar57,auVar23);
            if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0))
            goto LAB_0015c167;
            bVar53 = ((byte)uVar57 & 8) >> 3;
            uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53);
            uVar56 = (ulong)uVar57;
            if ((bVar53 != 0) ||
               ((bVar12 != false &&
                ((fVar61 = (pAVar15->p).field_0.m128[3], fVar61 != 1.0 || (NAN(fVar61)))))))
            goto LAB_0015c167;
            uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar44);
            pfVar1 = (float *)(lVar16 + -0x30 + lVar55);
            fVar62 = *pfVar1;
            local_208 = pfVar1[1];
            fVar63 = pfVar1[2];
            fVar99 = pfVar1[3];
            pfVar1 = (float *)(lVar16 + -0x20 + lVar55);
            fVar102 = *pfVar1;
            fVar84 = pfVar1[1];
            fVar93 = pfVar1[2];
            fVar95 = pfVar1[3];
            pfVar1 = (float *)(lVar16 + -0x10 + lVar55);
            fVar61 = *pfVar1;
            fVar73 = pfVar1[1];
            fVar70 = pfVar1[2];
            fVar80 = pfVar1[3];
            pfVar1 = (float *)(lVar16 + lVar55);
            fVar86 = *pfVar1;
            fVar100 = pfVar1[1];
            fVar101 = pfVar1[2];
            fVar79 = pfVar1[3];
          }
LAB_0015c8c0:
          pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x30);
          *pfVar1 = fVar62;
          pfVar1[1] = local_208;
          pfVar1[2] = fVar63;
          pfVar1[3] = fVar99;
          pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x20);
          *pfVar1 = fVar102;
          pfVar1[1] = fVar84;
          pfVar1[2] = fVar93;
          pfVar1[3] = fVar95;
          pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x10);
          *pfVar1 = fVar61;
          pfVar1[1] = fVar73;
          pfVar1[2] = fVar70;
          pfVar1[3] = fVar80;
          pfVar1 = (float *)((long)local_1c8 + lVar55);
          *pfVar1 = fVar86;
          pfVar1[1] = fVar100;
          pfVar1[2] = fVar101;
          pfVar1[3] = fVar79;
          uVar54 = uVar54 + 1;
          lVar55 = lVar55 + 0x40;
        } while (uVar54 < (ulong)plVar47[0xf]);
      }
    }
  }
  else {
    if (plVar47[0xf] == 1) {
      fVar61 = (spaces->time_range).lower;
      fVar63 = (spaces->time_range).upper;
      fVar73 = (float)plVar47[0xd];
      fVar99 = (float)((ulong)plVar47[0xd] >> 0x20);
      uVar57 = -(uint)(fVar61 < fVar73);
      uVar59 = -(uint)(fVar63 < fVar99);
      local_1e8._0_8_ =
           CONCAT44(~uVar59 & (uint)fVar99,~uVar57 & (uint)fVar61) |
           CONCAT44((uint)fVar63 & uVar59,(uint)fVar73 & uVar57);
      local_1d8._M_allocated_capacity = 0;
      local_1d8._8_8_ = 0;
      local_1c8 = (void *)0x0;
      if (sVar14 != 0) {
        local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        local_1c8 = alignedMalloc(sVar14 << 6,0x10);
        pvVar49 = (void *)0x1;
        if (spaces->quaternion == false) {
          pvVar49 = (void *)(ulong)*(uint *)(plVar47 + 0x12);
        }
        uStack_1c0 = CONCAT71(uStack_1c0._1_7_,(char)pvVar49);
        local_1d8._M_allocated_capacity = sVar14;
        local_1d8._8_8_ = sVar14;
        if ((spaces->spaces).size_active != 0) {
          lVar55 = 0x30;
          uVar54 = 0;
          uVar56 = extraout_RDX_03;
          do {
            uVar41 = uStack_1c0;
            uVar57 = (uint)uVar56;
            pAVar15 = (spaces->spaces).items;
            pfVar1 = (float *)plVar47[0x11];
            bVar12 = spaces->quaternion;
            uVar52 = (undefined7)((ulong)pvVar49 >> 8);
            uVar48 = CONCAT71(uVar52,bVar12);
            bVar44 = *(byte *)(plVar47 + 0x12);
            uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
            uVar42 = uStack_1c0;
            fVar61 = *(float *)((long)pAVar15 + lVar55 + -0x30);
            uVar9 = *(undefined8 *)((long)pAVar15 + lVar55 + -0x2c);
            fVar63 = (float)((ulong)uVar9 >> 0x20);
            local_208 = (float)uVar9;
            uStack_1c0._1_7_ = SUB87(uVar41,1);
            if ((((fVar61 != 1.0) || (NAN(fVar61))) || (local_208 != 0.0)) ||
               (((NAN(local_208) || (fVar63 != 0.0)) || (NAN(fVar63))))) {
LAB_0015ced2:
              fVar73 = (float)*(undefined8 *)pfVar1;
              fVar99 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
              iVar58 = -(uint)(fVar73 != 1.0);
              iVar60 = -(uint)(fVar99 != 0.0);
              auVar67._4_4_ = iVar60;
              auVar67._0_4_ = iVar58;
              auVar67._8_4_ = iVar60;
              auVar67._12_4_ = iVar60;
              auVar66._8_8_ = auVar67._8_8_;
              auVar66._4_4_ = iVar58;
              auVar66._0_4_ = iVar58;
              uVar57 = movmskpd(uVar57,auVar66);
              fVar61 = pfVar1[2];
              if (((uVar57 & 1) == 0) &&
                 (((bVar53 = (byte)uVar57 >> 1, bVar53 == 0 && (fVar61 == 0.0)) && (!NAN(fVar61)))))
              {
                auVar35._4_4_ = -(uint)(pfVar1[4] != 0.0);
                auVar35._0_4_ = -(uint)(pfVar1[3] != 0.0);
                auVar35._8_4_ = -(uint)(pfVar1[5] != 1.0);
                auVar35._12_4_ = -(uint)(pfVar1[6] != 0.0);
                uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar35);
                if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                   (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                  auVar36._4_4_ = -(uint)(pfVar1[8] != 0.0);
                  auVar36._0_4_ = -(uint)(pfVar1[7] != 0.0);
                  auVar36._8_4_ = -(uint)(pfVar1[9] != 0.0);
                  auVar36._12_4_ = -(uint)(pfVar1[10] != 1.0);
                  uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar36);
                  if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                     (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                    auVar37._4_4_ = -(uint)(pfVar1[0xc] != 0.0);
                    auVar37._0_4_ = -(uint)(pfVar1[0xb] != 0.0);
                    auVar37._8_4_ = -(uint)(pfVar1[0xd] != 0.0);
                    auVar37._12_4_ = -(uint)(pfVar1[0xe] != 0.0);
                    uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar37);
                    if ((((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                         ((uVar57 & 4) == 0)) &&
                        (bVar53 = ((byte)uVar57 & 8) >> 3,
                        uVar56 = (ulong)CONCAT31((int3)(uVar57 >> 8),bVar53), bVar53 == 0)) &&
                       ((bVar44 == 0 || ((pfVar1[0xf] == 1.0 && (!NAN(pfVar1[0xf]))))))) {
                      uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar12);
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x30);
                      fVar62 = *pfVar1;
                      local_208 = pfVar1[1];
                      fVar63 = pfVar1[2];
                      fVar99 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x20);
                      fVar102 = *pfVar1;
                      fVar84 = pfVar1[1];
                      fVar93 = pfVar1[2];
                      fVar95 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x10);
                      fVar61 = *pfVar1;
                      fVar73 = pfVar1[1];
                      fVar70 = pfVar1[2];
                      fVar80 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                      fVar86 = *pfVar1;
                      fVar100 = pfVar1[1];
                      fVar101 = pfVar1[2];
                      fVar79 = pfVar1[3];
                      goto LAB_0015d620;
                    }
                  }
                }
              }
              uVar56 = uVar48 & 0xffffffff;
              bVar53 = (byte)uVar56 | bVar44;
              uVar56 = CONCAT71((int7)(uVar56 >> 8),bVar53);
              uStack_1c0 = uVar42;
              if (bVar53 == 0) {
                pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x30);
                fVar101 = *pfVar2;
                fVar103 = pfVar2[1];
                fVar109 = pfVar2[2];
                fVar112 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x20);
                fVar71 = *pfVar2;
                fVar72 = pfVar2[1];
                fVar74 = pfVar2[2];
                fVar105 = pfVar2[3];
                pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x10);
                fVar75 = *pfVar2;
                fVar76 = pfVar2[1];
                fVar110 = pfVar2[2];
                fVar77 = pfVar2[3];
                fVar62 = fVar73 * fVar101 + fVar99 * fVar71 + fVar61 * fVar75;
                local_208 = fVar73 * fVar103 + fVar99 * fVar72 + fVar61 * fVar76;
                fVar63 = fVar73 * fVar109 + fVar99 * fVar74 + fVar61 * fVar110;
                fVar99 = fVar73 * fVar112 + fVar99 * fVar105 + fVar61 * fVar77;
                fVar61 = pfVar1[4];
                fVar73 = pfVar1[5];
                fVar95 = pfVar1[6];
                fVar80 = pfVar1[8];
                fVar102 = fVar61 * fVar101 + fVar73 * fVar71 + fVar95 * fVar75;
                fVar84 = fVar61 * fVar103 + fVar73 * fVar72 + fVar95 * fVar76;
                fVar93 = fVar61 * fVar109 + fVar73 * fVar74 + fVar95 * fVar110;
                fVar95 = fVar61 * fVar112 + fVar73 * fVar105 + fVar95 * fVar77;
                fVar86 = pfVar1[9];
                fVar100 = pfVar1[10];
                fVar61 = fVar80 * fVar101 + fVar86 * fVar71 + fVar100 * fVar75;
                fVar73 = fVar80 * fVar103 + fVar86 * fVar72 + fVar100 * fVar76;
                fVar70 = fVar80 * fVar109 + fVar86 * fVar74 + fVar100 * fVar110;
                fVar80 = fVar80 * fVar112 + fVar86 * fVar105 + fVar100 * fVar77;
                fVar79 = pfVar1[0xc];
                fVar7 = pfVar1[0xd];
                fVar8 = pfVar1[0xe];
                pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                fVar86 = fVar79 * fVar101 + fVar7 * fVar71 + fVar8 * fVar75 + *pfVar1;
                fVar100 = fVar79 * fVar103 + fVar7 * fVar72 + fVar8 * fVar76 + pfVar1[1];
                fVar101 = fVar79 * fVar109 + fVar7 * fVar74 + fVar8 * fVar110 + pfVar1[2];
                fVar79 = fVar79 * fVar112 + fVar7 * fVar105 + fVar8 * fVar77 + pfVar1[3];
              }
              else {
                uVar48 = uVar48 & 0xffffffff;
                bVar53 = (byte)uVar48 & bVar44;
                uVar56 = CONCAT71((int7)(uVar48 >> 8),bVar53);
                if (bVar53 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                  std::ostream::put(-0x38);
                  std::ostream::flush();
                  fVar61 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc);
                  fVar63 = *(float *)((long)pAVar15 + lVar55 + -0x24);
                  fVar73 = *(float *)((long)pAVar15 + lVar55 + -0x14);
                  fVar99 = *(float *)((long)pAVar15 + lVar55 + -4);
                  auVar11 = *(undefined1 (*) [16])((long)pAVar15 + lVar55 + -0x30);
                  pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x20);
                  fVar62 = *pfVar2;
                  fVar102 = pfVar2[1];
                  pfVar3 = (float *)((long)pAVar15 + lVar55 + -0x10);
                  fVar84 = *pfVar3;
                  fVar93 = pfVar3[1];
                  fVar95 = pfVar3[2];
                  fVar103 = fVar63 * fVar73 + fVar61 * fVar99;
                  fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                  fVar86 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                  fVar100 = fVar61 * fVar61 - fVar63 * fVar63;
                  fVar101 = fVar73 * fVar73 + fVar100 + -fVar99 * fVar99;
                  fVar112 = fVar63 * fVar99 - fVar61 * fVar73;
                  fVar70 = fVar61 * fVar73 + fVar63 * fVar99;
                  fVar109 = fVar73 * fVar99 + fVar61 * fVar63;
                  fVar61 = fVar73 * fVar99 - fVar61 * fVar63;
                  pfVar3 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                  fVar79 = *pfVar3;
                  fVar7 = pfVar3[1];
                  fVar8 = pfVar3[2];
                  fVar103 = fVar103 + fVar103;
                  fVar112 = fVar112 + fVar112;
                  fVar80 = fVar80 + fVar80;
                  fVar109 = fVar109 + fVar109;
                  fVar70 = fVar70 + fVar70;
                  fVar61 = fVar61 + fVar61;
                  fVar63 = fVar99 * fVar99 + fVar100 + -fVar73 * fVar73;
                  fVar87 = fVar86 * 1.0 + fVar103 * 0.0 + fVar112 * 0.0;
                  fVar89 = fVar86 * 0.0 + fVar103 * 1.0 + fVar112 * 0.0;
                  fVar91 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 1.0;
                  fVar94 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 0.0;
                  fVar81 = fVar80 * 1.0 + fVar101 * 0.0 + fVar109 * 0.0;
                  fVar82 = fVar80 * 0.0 + fVar101 * 1.0 + fVar109 * 0.0;
                  fVar83 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 1.0;
                  fVar85 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 0.0;
                  fVar86 = fVar70 * 1.0 + fVar61 * 0.0 + fVar63 * 0.0;
                  fVar100 = fVar70 * 0.0 + fVar61 * 1.0 + fVar63 * 0.0;
                  fVar101 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 1.0;
                  fVar71 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 0.0;
                  local_1f8 = auVar11._4_4_;
                  fStack_1f4 = auVar11._8_4_;
                  local_208 = auVar11._0_4_;
                  fVar104 = local_208 * fVar87 + fVar81 * 0.0 + fVar86 * 0.0;
                  fVar106 = local_208 * fVar89 + fVar82 * 0.0 + fVar100 * 0.0;
                  fVar107 = local_208 * fVar91 + fVar83 * 0.0 + fVar101 * 0.0;
                  fVar108 = local_208 * fVar94 + fVar85 * 0.0 + fVar71 * 0.0;
                  fVar103 = fVar62 * fVar87 + fVar102 * fVar81 + fVar86 * 0.0;
                  fVar109 = fVar62 * fVar89 + fVar102 * fVar82 + fVar100 * 0.0;
                  fVar112 = fVar62 * fVar91 + fVar102 * fVar83 + fVar101 * 0.0;
                  fVar72 = fVar62 * fVar94 + fVar102 * fVar85 + fVar71 * 0.0;
                  local_168 = fVar84 * fVar87 + fVar93 * fVar81 + fVar95 * fVar86;
                  fStack_164 = fVar84 * fVar89 + fVar93 * fVar82 + fVar95 * fVar100;
                  fStack_160 = fVar84 * fVar91 + fVar93 * fVar83 + fVar95 * fVar101;
                  fStack_15c = fVar84 * fVar94 + fVar93 * fVar85 + fVar95 * fVar71;
                  fVar61 = pfVar1[0xf];
                  fVar63 = pfVar1[3];
                  fVar73 = pfVar1[7];
                  fVar99 = pfVar1[0xb];
                  fVar105 = fVar63 * fVar73 + fVar61 * fVar99;
                  fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                  fVar74 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                  fVar102 = fVar61 * fVar61 - fVar63 * fVar63;
                  fVar111 = fVar73 * fVar73 + fVar102 + -fVar99 * fVar99;
                  fVar110 = fVar63 * fVar99 - fVar61 * fVar73;
                  fVar77 = fVar61 * fVar73 + fVar63 * fVar99;
                  fVar113 = fVar73 * fVar99 + fVar61 * fVar63;
                  fVar70 = fVar73 * fVar99 - fVar61 * fVar63;
                  fVar61 = *pfVar1;
                  fVar63 = pfVar1[4];
                  fVar62 = pfVar1[5];
                  fVar96 = fVar99 * fVar99 + fVar102 + -fVar73 * fVar73;
                  fVar73 = pfVar1[8];
                  fVar99 = pfVar1[9];
                  fVar102 = pfVar1[10];
                  fVar105 = fVar105 + fVar105;
                  fVar110 = fVar110 + fVar110;
                  fVar84 = pfVar1[0xc];
                  fVar93 = pfVar1[0xd];
                  fVar95 = pfVar1[0xe];
                  fVar75 = fVar74 * 1.0 + fVar105 * 0.0 + fVar110 * 0.0;
                  fVar76 = fVar74 * 0.0 + fVar105 * 1.0 + fVar110 * 0.0;
                  fVar110 = fVar74 * 0.0 + fVar105 * 0.0 + fVar110 * 1.0;
                  fVar80 = fVar80 + fVar80;
                  fVar113 = fVar113 + fVar113;
                  fVar77 = fVar77 + fVar77;
                  fVar70 = fVar70 + fVar70;
                  fVar74 = fVar80 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                  fVar105 = fVar80 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                  fVar80 = fVar80 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                  fVar111 = fVar77 * 1.0 + fVar70 * 0.0 + fVar96 * 0.0;
                  fVar113 = fVar77 * 0.0 + fVar70 * 1.0 + fVar96 * 0.0;
                  fVar70 = fVar77 * 0.0 + fVar70 * 0.0 + fVar96 * 1.0;
                  fVar88 = fVar61 * fVar75 + fVar74 * 0.0 + fVar111 * 0.0;
                  fVar90 = fVar61 * fVar76 + fVar105 * 0.0 + fVar113 * 0.0;
                  fVar92 = fVar61 * fVar110 + fVar80 * 0.0 + fVar70 * 0.0;
                  fVar77 = fVar63 * fVar75 + fVar62 * fVar74 + fVar111 * 0.0;
                  fVar96 = fVar63 * fVar76 + fVar62 * fVar105 + fVar113 * 0.0;
                  fVar78 = fVar63 * fVar110 + fVar62 * fVar80 + fVar70 * 0.0;
                  fVar97 = fVar73 * fVar75 + fVar99 * fVar74 + fVar102 * fVar111;
                  fVar98 = fVar73 * fVar76 + fVar99 * fVar105 + fVar102 * fVar113;
                  fVar99 = fVar73 * fVar110 + fVar99 * fVar80 + fVar102 * fVar70;
                  fVar102 = fVar84 * fVar75 + fVar93 * fVar74 + fVar95 * fVar111 + pfVar1[1] + 0.0;
                  fVar74 = fVar84 * fVar76 + fVar93 * fVar105 + fVar95 * fVar113 + pfVar1[2] + 0.0;
                  fVar84 = fVar84 * fVar110 + fVar93 * fVar80 + fVar95 * fVar70 + pfVar1[6] + 0.0;
                  fVar62 = fVar88 * fVar104 + fVar90 * fVar103 + fVar92 * local_168;
                  local_208 = fVar88 * fVar106 + fVar90 * fVar109 + fVar92 * fStack_164;
                  fVar63 = fVar88 * fVar107 + fVar90 * fVar112 + fVar92 * fStack_160;
                  fVar61 = fVar97 * fVar104 + fVar98 * fVar103 + fVar99 * local_168;
                  fVar73 = fVar97 * fVar106 + fVar98 * fVar109 + fVar99 * fStack_164;
                  fVar70 = fVar97 * fVar107 + fVar98 * fVar112 + fVar99 * fStack_160;
                  uVar56 = extraout_RDX_04;
                  fVar80 = fVar97 * fVar108 + fVar98 * fVar72 + fVar99 * fStack_15c;
                  fVar99 = fVar88 * fVar108 + fVar90 * fVar72 + fVar92 * fStack_15c;
                  fVar86 = fVar102 * fVar104 + fVar74 * fVar103 + fVar84 * local_168 +
                           fVar79 * fVar87 + fVar7 * fVar81 + fVar8 * fVar86 + local_1f8 + 0.0;
                  fVar100 = fVar102 * fVar106 + fVar74 * fVar109 + fVar84 * fStack_164 +
                            fVar79 * fVar89 + fVar7 * fVar82 + fVar8 * fVar100 + fStack_1f4 + 0.0;
                  fVar101 = fVar102 * fVar107 + fVar74 * fVar112 + fVar84 * fStack_160 +
                            fVar79 * fVar91 + fVar7 * fVar83 + fVar8 * fVar101 + pfVar2[2] + 0.0;
                  fVar79 = fVar102 * fVar108 + fVar74 * fVar72 + fVar84 * fStack_15c +
                           fVar79 * fVar94 + fVar7 * fVar85 + fVar8 * fVar71 + 0.0;
                  fVar102 = fVar77 * fVar104 + fVar96 * fVar103 + fVar78 * local_168;
                  fVar84 = fVar77 * fVar106 + fVar96 * fVar109 + fVar78 * fStack_164;
                  fVar93 = fVar77 * fVar107 + fVar96 * fVar112 + fVar78 * fStack_160;
                  fVar95 = fVar77 * fVar108 + fVar96 * fVar72 + fVar78 * fStack_15c;
                }
                else {
                  bVar44 = bVar12 ^ 1U | bVar44;
                  if (bVar44 == 0) {
                    local_f8 = ZEXT416(*(uint *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc));
                    local_d8 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -0x24));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -0x14));
                    local_108 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -4));
                    pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x20);
                    local_128 = *pfVar2;
                    fStack_124 = pfVar2[1];
                    fStack_e0 = pfVar2[2];
                    fStack_11c = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x10);
                    local_118 = *pfVar2;
                    fStack_114 = pfVar2[1];
                    fStack_110 = pfVar2[2];
                    fStack_10c = pfVar2[3];
                    pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x30);
                    local_a8 = *pfVar2;
                    fStack_9c = pfVar2[1];
                    fVar61 = *pfVar1;
                    fVar73 = pfVar1[1];
                    fVar99 = pfVar1[2];
                    fVar102 = pfVar1[4];
                    fVar84 = pfVar1[5];
                    fVar93 = pfVar1[6];
                    local_138 = *(undefined8 *)(pfVar1 + 8);
                    uStack_130 = *(undefined8 *)(pfVar1 + 10);
                    fVar95 = pfVar1[0xc];
                    fVar70 = pfVar1[0xd];
                    fVar80 = pfVar1[0xe];
                    fVar62 = fVar61 * local_a8 + fVar73 * local_128 + fVar99 * local_118;
                    fVar86 = fVar61 * 0.0 + fVar73 * fStack_124 + fVar99 * fStack_114;
                    fVar61 = fVar61 * 0.0 + fVar73 * 0.0 + fVar99 * fStack_110;
                    local_168 = fVar102 * local_a8 + fVar84 * local_128 + fVar93 * local_118;
                    fStack_164 = fVar102 * 0.0 + fVar84 * fStack_124 + fVar93 * fStack_114;
                    fStack_160 = fVar102 * 0.0 + fVar84 * 0.0 + fVar93 * fStack_110;
                    fStack_15c = fVar102 * fStack_9c + fVar84 * fStack_11c + fVar93 * fStack_10c;
                    fStack_120 = 0.0;
                    fStack_a4 = 0.0;
                    fStack_a0 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                    local_b8._0_4_ =
                         fVar95 * local_a8 + fVar70 * local_128 + fVar80 * local_118 + *pfVar1;
                    local_b8._4_4_ =
                         fVar95 * 0.0 + fVar70 * fStack_124 + fVar80 * fStack_114 + pfVar1[1];
                    fStack_b0 = fVar95 * 0.0 + fVar70 * 0.0 + fVar80 * fStack_110 + pfVar1[2];
                    register0x0000128c =
                         fVar95 * fStack_9c + fVar70 * fStack_11c + fVar80 * fStack_10c + pfVar1[3];
                    local_e8 = local_128;
                    fStack_e4 = fStack_124;
                    fStack_dc = fStack_11c;
                    if (((fVar86 != 0.0) || (NAN(fVar86))) ||
                       ((fVar61 != 0.0 ||
                        (((NAN(fVar61) || (fStack_160 != 0.0)) || (NAN(fStack_160))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      uVar56 = extraout_RDX_06;
                    }
                    fVar61 = local_a8 * (float)local_138 +
                             local_128 * local_138._4_4_ + local_118 * (float)uStack_130;
                    fVar73 = fStack_a4 * (float)local_138 +
                             fStack_124 * local_138._4_4_ + fStack_114 * (float)uStack_130;
                    fVar70 = fStack_a0 * (float)local_138 +
                             fStack_120 * local_138._4_4_ + fStack_110 * (float)uStack_130;
                    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                    fVar80 = (float)local_108._0_4_;
                    fVar99 = (float)local_d8._0_4_;
                    fVar86 = (float)local_b8._0_4_;
                    fVar100 = (float)local_b8._4_4_;
                    fVar101 = fStack_b0;
                    fVar79 = (float)local_f8._0_4_;
                    fVar102 = local_168;
                    fVar84 = fStack_164;
                    fVar93 = fStack_e0;
                    fVar95 = (float)local_c8._0_4_;
                  }
                  else {
                    if (((local_208 != 0.0) || (NAN(local_208))) ||
                       ((fVar63 != 0.0 ||
                        ((NAN(fVar63) ||
                         (uVar9 = *(undefined8 *)((long)pAVar15 + lVar55 + -0x10),
                         auVar28._4_4_ = -(uint)(*(float *)((long)pAVar15 + lVar55 + -0x20) != 0.0),
                         auVar28._0_4_ = -(uint)(*(float *)((long)pAVar15 + lVar55 + -0x18) != 0.0),
                         auVar28._8_4_ = -(uint)((float)uVar9 != 0.0),
                         auVar28._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                         uVar46 = movmskps((int)CONCAT71(uVar52,bVar44),auVar28),
                         (char)uVar46 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      uVar56 = extraout_RDX_05;
                    }
                    fVar61 = pfVar1[8];
                    fVar73 = pfVar1[9];
                    uVar9 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                    fVar62 = *(float *)((long)pAVar15 + lVar55 + -0x30) * *pfVar1;
                    local_208 = pfVar1[1] + (float)uVar9;
                    fVar63 = pfVar1[2] + (float)((ulong)uVar9 >> 0x20);
                    fVar70 = pfVar1[10] * *(float *)((long)pAVar15 + lVar55 + -8);
                    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                    fVar80 = pfVar1[0xb];
                    fVar99 = pfVar1[3];
                    fVar86 = pfVar1[0xc];
                    fVar100 = pfVar1[0xd];
                    fVar101 = pfVar1[0xe];
                    fVar79 = pfVar1[0xf];
                    fVar102 = pfVar1[4];
                    fVar84 = pfVar1[5] * *(float *)((long)pAVar15 + lVar55 + -0x1c);
                    fVar93 = pfVar1[6] + *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 8);
                    fVar95 = pfVar1[7];
                  }
                }
              }
            }
            else {
              pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x24);
              auVar25._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar25._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar25._8_4_ = -(uint)(pfVar2[2] != 1.0);
              auVar25._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar57 = movmskps(uVar57,auVar25);
              if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) ||
                 (((uVar57 & 4) != 0 ||
                  (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53),
                  bVar53 != 0)))) goto LAB_0015ced2;
              pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x14);
              auVar26._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar26._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar26._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar26._12_4_ = -(uint)(pfVar2[3] != 1.0);
              uVar57 = movmskps(uVar57,auVar26);
              if (((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0))
                 || (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53)
                    , bVar53 != 0)) goto LAB_0015ced2;
              pfVar2 = (float *)((long)pAVar15 + lVar55 + -4);
              auVar27._4_4_ = -(uint)(pfVar2[1] != 0.0);
              auVar27._0_4_ = -(uint)(*pfVar2 != 0.0);
              auVar27._8_4_ = -(uint)(pfVar2[2] != 0.0);
              auVar27._12_4_ = -(uint)(pfVar2[3] != 0.0);
              uVar57 = movmskps(uVar57,auVar27);
              if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0))
              goto LAB_0015ced2;
              bVar53 = ((byte)uVar57 & 8) >> 3;
              uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53);
              uVar56 = (ulong)uVar57;
              if ((bVar53 != 0) ||
                 ((bVar12 != false &&
                  ((fVar61 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc),
                   fVar61 != 1.0 || (NAN(fVar61))))))) goto LAB_0015ced2;
              uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar44);
              fVar62 = *pfVar1;
              local_208 = pfVar1[1];
              fVar63 = pfVar1[2];
              fVar99 = pfVar1[3];
              fVar102 = pfVar1[4];
              fVar84 = pfVar1[5];
              fVar93 = pfVar1[6];
              fVar95 = pfVar1[7];
              fVar61 = pfVar1[8];
              fVar73 = pfVar1[9];
              fVar70 = pfVar1[10];
              fVar80 = pfVar1[0xb];
              fVar86 = pfVar1[0xc];
              fVar100 = pfVar1[0xd];
              fVar101 = pfVar1[0xe];
              fVar79 = pfVar1[0xf];
            }
LAB_0015d620:
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x30);
            *pfVar1 = fVar62;
            pfVar1[1] = local_208;
            pfVar1[2] = fVar63;
            pfVar1[3] = fVar99;
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x20);
            *pfVar1 = fVar102;
            pfVar1[1] = fVar84;
            pfVar1[2] = fVar93;
            pfVar1[3] = fVar95;
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x10);
            *pfVar1 = fVar61;
            pfVar1[1] = fVar73;
            pfVar1[2] = fVar70;
            pfVar1[3] = fVar80;
            pfVar1 = (float *)((long)local_1c8 + lVar55);
            *pfVar1 = fVar86;
            pfVar1[1] = fVar100;
            pfVar1[2] = fVar101;
            pfVar1[3] = fVar79;
            uVar54 = uVar54 + 1;
            lVar55 = lVar55 + 0x40;
            pvVar49 = local_1c8;
          } while (uVar54 < (spaces->spaces).size_active);
        }
        goto LAB_0015e81a;
      }
    }
    else {
      if (sVar14 != plVar47[0xf]) {
        local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        prVar51 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar51,"number of transformations does not match");
        __cxa_throw(prVar51,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      fVar61 = (spaces->time_range).lower;
      fVar63 = (spaces->time_range).upper;
      fVar73 = (float)plVar47[0xd];
      fVar99 = (float)((ulong)plVar47[0xd] >> 0x20);
      uVar57 = -(uint)(fVar61 < fVar73);
      uVar59 = -(uint)(fVar63 < fVar99);
      local_1e8._0_8_ =
           CONCAT44(~uVar59 & (uint)fVar99,~uVar57 & (uint)fVar61) |
           CONCAT44((uint)fVar63 & uVar59,(uint)fVar73 & uVar57);
      local_1d8._M_allocated_capacity = 0;
      local_1d8._8_8_ = 0;
      local_1c8 = (void *)0x0;
      if (sVar14 != 0) {
        local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                     *)group;
        local_1c8 = alignedMalloc(sVar14 << 6,0x10);
        pvVar49 = (void *)0x1;
        if (spaces->quaternion == false) {
          pvVar49 = (void *)(ulong)*(uint *)(plVar47 + 0x12);
        }
        uStack_1c0 = CONCAT71(uStack_1c0._1_7_,(char)pvVar49);
        local_1d8._M_allocated_capacity = sVar14;
        local_1d8._8_8_ = sVar14;
        if ((spaces->spaces).size_active != 0) {
          lVar55 = 0x30;
          uVar54 = 0;
          uVar56 = extraout_RDX_07;
          do {
            uVar41 = uStack_1c0;
            uVar57 = (uint)uVar56;
            pAVar15 = (spaces->spaces).items;
            lVar16 = plVar47[0x11];
            bVar12 = spaces->quaternion;
            uVar52 = (undefined7)((ulong)pvVar49 >> 8);
            uVar48 = CONCAT71(uVar52,bVar12);
            bVar44 = *(byte *)(plVar47 + 0x12);
            uStack_1c0 = uStack_1c0 & 0xffffffffffffff00;
            uVar42 = uStack_1c0;
            fVar61 = *(float *)((long)pAVar15 + lVar55 + -0x30);
            uVar9 = *(undefined8 *)((long)pAVar15 + lVar55 + -0x2c);
            fVar63 = (float)((ulong)uVar9 >> 0x20);
            local_208 = (float)uVar9;
            uStack_1c0._1_7_ = SUB87(uVar41,1);
            if (((((fVar61 != 1.0) || (NAN(fVar61))) || (local_208 != 0.0)) ||
                ((NAN(local_208) || (fVar63 != 0.0)))) || (NAN(fVar63))) {
LAB_0015dbe6:
              uVar9 = *(undefined8 *)(lVar16 + -0x30 + lVar55);
              fVar73 = (float)uVar9;
              fVar99 = (float)((ulong)uVar9 >> 0x20);
              iVar58 = -(uint)(fVar73 != 1.0);
              iVar60 = -(uint)(fVar99 != 0.0);
              auVar69._4_4_ = iVar60;
              auVar69._0_4_ = iVar58;
              auVar69._8_4_ = iVar60;
              auVar69._12_4_ = iVar60;
              auVar68._8_8_ = auVar69._8_8_;
              auVar68._4_4_ = iVar58;
              auVar68._0_4_ = iVar58;
              uVar57 = movmskpd(uVar57,auVar68);
              fVar61 = *(float *)(lVar16 + -0x28 + lVar55);
              if (((uVar57 & 1) == 0) &&
                 (((bVar53 = (byte)uVar57 >> 1, bVar53 == 0 && (fVar61 == 0.0)) && (!NAN(fVar61)))))
              {
                pfVar1 = (float *)(lVar16 + -0x24 + lVar55);
                auVar38._4_4_ = -(uint)(pfVar1[1] != 0.0);
                auVar38._0_4_ = -(uint)(*pfVar1 != 0.0);
                auVar38._8_4_ = -(uint)(pfVar1[2] != 1.0);
                auVar38._12_4_ = -(uint)(pfVar1[3] != 0.0);
                uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar38);
                if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                   (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                  pfVar1 = (float *)(lVar16 + -0x14 + lVar55);
                  auVar39._4_4_ = -(uint)(pfVar1[1] != 0.0);
                  auVar39._0_4_ = -(uint)(*pfVar1 != 0.0);
                  auVar39._8_4_ = -(uint)(pfVar1[2] != 0.0);
                  auVar39._12_4_ = -(uint)(pfVar1[3] != 1.0);
                  uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar39);
                  if ((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                     (((uVar57 & 4) == 0 && (bVar53 = ((byte)uVar57 & 8) >> 3, bVar53 == 0)))) {
                    pfVar1 = (float *)(lVar16 + -4 + lVar55);
                    auVar40._4_4_ = -(uint)(pfVar1[1] != 0.0);
                    auVar40._0_4_ = -(uint)(*pfVar1 != 0.0);
                    auVar40._8_4_ = -(uint)(pfVar1[2] != 0.0);
                    auVar40._12_4_ = -(uint)(pfVar1[3] != 0.0);
                    uVar57 = movmskps(CONCAT31((int3)(uVar57 >> 8),bVar53),auVar40);
                    if ((((((bVar44 & (byte)uVar57) == 0) && ((uVar57 & 2) == 0)) &&
                         ((uVar57 & 4) == 0)) &&
                        (bVar53 = ((byte)uVar57 & 8) >> 3,
                        uVar56 = (ulong)CONCAT31((int3)(uVar57 >> 8),bVar53), bVar53 == 0)) &&
                       ((bVar44 == 0 ||
                        ((fVar62 = *(float *)(lVar16 + 0xc + lVar55), fVar62 == 1.0 &&
                         (!NAN(fVar62))))))) {
                      uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar12);
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x30);
                      fVar62 = *pfVar1;
                      local_208 = pfVar1[1];
                      fVar63 = pfVar1[2];
                      fVar99 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x20);
                      fVar102 = *pfVar1;
                      fVar84 = pfVar1[1];
                      fVar93 = pfVar1[2];
                      fVar95 = pfVar1[3];
                      pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x10);
                      fVar61 = *pfVar1;
                      fVar73 = pfVar1[1];
                      fVar70 = pfVar1[2];
                      fVar80 = pfVar1[3];
                      pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                      fVar86 = *pfVar1;
                      fVar100 = pfVar1[1];
                      fVar101 = pfVar1[2];
                      fVar79 = pfVar1[3];
                      goto LAB_0015e34b;
                    }
                  }
                }
              }
              uVar56 = uVar48 & 0xffffffff;
              bVar53 = (byte)uVar56 | bVar44;
              uVar56 = CONCAT71((int7)(uVar56 >> 8),bVar53);
              uStack_1c0 = uVar42;
              if (bVar53 == 0) {
                pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x30);
                fVar101 = *pfVar1;
                fVar103 = pfVar1[1];
                fVar109 = pfVar1[2];
                fVar112 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x20);
                fVar71 = *pfVar1;
                fVar72 = pfVar1[1];
                fVar74 = pfVar1[2];
                fVar105 = pfVar1[3];
                pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x10);
                fVar75 = *pfVar1;
                fVar76 = pfVar1[1];
                fVar110 = pfVar1[2];
                fVar77 = pfVar1[3];
                fVar62 = fVar73 * fVar101 + fVar99 * fVar71 + fVar61 * fVar75;
                local_208 = fVar73 * fVar103 + fVar99 * fVar72 + fVar61 * fVar76;
                fVar63 = fVar73 * fVar109 + fVar99 * fVar74 + fVar61 * fVar110;
                fVar99 = fVar73 * fVar112 + fVar99 * fVar105 + fVar61 * fVar77;
                fVar61 = *(float *)(lVar16 + -0x20 + lVar55);
                fVar73 = *(float *)(lVar16 + -0x1c + lVar55);
                fVar95 = *(float *)(lVar16 + -0x18 + lVar55);
                fVar80 = *(float *)(lVar16 + -0x10 + lVar55);
                fVar102 = fVar61 * fVar101 + fVar73 * fVar71 + fVar95 * fVar75;
                fVar84 = fVar61 * fVar103 + fVar73 * fVar72 + fVar95 * fVar76;
                fVar93 = fVar61 * fVar109 + fVar73 * fVar74 + fVar95 * fVar110;
                fVar95 = fVar61 * fVar112 + fVar73 * fVar105 + fVar95 * fVar77;
                fVar86 = *(float *)(lVar16 + -0xc + lVar55);
                fVar100 = *(float *)(lVar16 + -8 + lVar55);
                fVar61 = fVar80 * fVar101 + fVar86 * fVar71 + fVar100 * fVar75;
                fVar73 = fVar80 * fVar103 + fVar86 * fVar72 + fVar100 * fVar76;
                fVar70 = fVar80 * fVar109 + fVar86 * fVar74 + fVar100 * fVar110;
                fVar80 = fVar80 * fVar112 + fVar86 * fVar105 + fVar100 * fVar77;
                fVar79 = *(float *)(lVar16 + lVar55);
                fVar7 = *(float *)(lVar16 + 4 + lVar55);
                fVar8 = *(float *)(lVar16 + 8 + lVar55);
                pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                fVar86 = fVar79 * fVar101 + fVar7 * fVar71 + fVar8 * fVar75 + *pfVar1;
                fVar100 = fVar79 * fVar103 + fVar7 * fVar72 + fVar8 * fVar76 + pfVar1[1];
                fVar101 = fVar79 * fVar109 + fVar7 * fVar74 + fVar8 * fVar110 + pfVar1[2];
                fVar79 = fVar79 * fVar112 + fVar7 * fVar105 + fVar8 * fVar77 + pfVar1[3];
              }
              else {
                uVar48 = uVar48 & 0xffffffff;
                bVar53 = (byte)uVar48 & bVar44;
                uVar56 = CONCAT71((int7)(uVar48 >> 8),bVar53);
                if (bVar53 == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "warning: cannot multiply two quaternion decompositions. will convert to regular transforms and multiply"
                             ,0x67);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                  std::ostream::put(-0x38);
                  std::ostream::flush();
                  fVar61 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc);
                  fVar63 = *(float *)((long)pAVar15 + lVar55 + -0x24);
                  fVar73 = *(float *)((long)pAVar15 + lVar55 + -0x14);
                  fVar99 = *(float *)((long)pAVar15 + lVar55 + -4);
                  auVar11 = *(undefined1 (*) [16])((long)pAVar15 + lVar55 + -0x30);
                  pfVar2 = (float *)((long)pAVar15 + lVar55 + -0x20);
                  fVar62 = *pfVar2;
                  fVar102 = pfVar2[1];
                  pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x10);
                  fVar84 = *pfVar1;
                  fVar93 = pfVar1[1];
                  fVar95 = pfVar1[2];
                  fVar103 = fVar63 * fVar73 + fVar61 * fVar99;
                  fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                  fVar86 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                  fVar100 = fVar61 * fVar61 - fVar63 * fVar63;
                  fVar101 = fVar73 * fVar73 + fVar100 + -fVar99 * fVar99;
                  fVar112 = fVar63 * fVar99 - fVar61 * fVar73;
                  fVar70 = fVar61 * fVar73 + fVar63 * fVar99;
                  fVar109 = fVar73 * fVar99 + fVar61 * fVar63;
                  fVar61 = fVar73 * fVar99 - fVar61 * fVar63;
                  pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                  fVar79 = *pfVar1;
                  fVar7 = pfVar1[1];
                  fVar8 = pfVar1[2];
                  fVar103 = fVar103 + fVar103;
                  fVar112 = fVar112 + fVar112;
                  fVar80 = fVar80 + fVar80;
                  fVar109 = fVar109 + fVar109;
                  fVar70 = fVar70 + fVar70;
                  fVar61 = fVar61 + fVar61;
                  fVar63 = fVar99 * fVar99 + fVar100 + -fVar73 * fVar73;
                  fVar87 = fVar86 * 1.0 + fVar103 * 0.0 + fVar112 * 0.0;
                  fVar89 = fVar86 * 0.0 + fVar103 * 1.0 + fVar112 * 0.0;
                  fVar91 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 1.0;
                  fVar94 = fVar86 * 0.0 + fVar103 * 0.0 + fVar112 * 0.0;
                  fVar81 = fVar80 * 1.0 + fVar101 * 0.0 + fVar109 * 0.0;
                  fVar82 = fVar80 * 0.0 + fVar101 * 1.0 + fVar109 * 0.0;
                  fVar83 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 1.0;
                  fVar85 = fVar80 * 0.0 + fVar101 * 0.0 + fVar109 * 0.0;
                  fVar86 = fVar70 * 1.0 + fVar61 * 0.0 + fVar63 * 0.0;
                  fVar100 = fVar70 * 0.0 + fVar61 * 1.0 + fVar63 * 0.0;
                  fVar101 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 1.0;
                  fVar71 = fVar70 * 0.0 + fVar61 * 0.0 + fVar63 * 0.0;
                  local_1f8 = auVar11._4_4_;
                  fStack_1f4 = auVar11._8_4_;
                  local_208 = auVar11._0_4_;
                  fVar104 = local_208 * fVar87 + fVar81 * 0.0 + fVar86 * 0.0;
                  fVar106 = local_208 * fVar89 + fVar82 * 0.0 + fVar100 * 0.0;
                  fVar107 = local_208 * fVar91 + fVar83 * 0.0 + fVar101 * 0.0;
                  fVar108 = local_208 * fVar94 + fVar85 * 0.0 + fVar71 * 0.0;
                  fVar103 = fVar62 * fVar87 + fVar102 * fVar81 + fVar86 * 0.0;
                  fVar109 = fVar62 * fVar89 + fVar102 * fVar82 + fVar100 * 0.0;
                  fVar112 = fVar62 * fVar91 + fVar102 * fVar83 + fVar101 * 0.0;
                  fVar72 = fVar62 * fVar94 + fVar102 * fVar85 + fVar71 * 0.0;
                  local_168 = fVar84 * fVar87 + fVar93 * fVar81 + fVar95 * fVar86;
                  fStack_164 = fVar84 * fVar89 + fVar93 * fVar82 + fVar95 * fVar100;
                  fStack_160 = fVar84 * fVar91 + fVar93 * fVar83 + fVar95 * fVar101;
                  fStack_15c = fVar84 * fVar94 + fVar93 * fVar85 + fVar95 * fVar71;
                  fVar61 = *(float *)(lVar16 + 0xc + lVar55);
                  fVar63 = *(float *)(lVar16 + -0x24 + lVar55);
                  fVar73 = *(float *)(lVar16 + -0x14 + lVar55);
                  fVar99 = *(float *)(lVar16 + -4 + lVar55);
                  fVar105 = fVar63 * fVar73 + fVar61 * fVar99;
                  fVar80 = fVar63 * fVar73 - fVar61 * fVar99;
                  fVar74 = fVar61 * fVar61 + fVar63 * fVar63 + -fVar73 * fVar73 + -fVar99 * fVar99;
                  fVar102 = fVar61 * fVar61 - fVar63 * fVar63;
                  fVar111 = fVar73 * fVar73 + fVar102 + -fVar99 * fVar99;
                  fVar110 = fVar63 * fVar99 - fVar61 * fVar73;
                  fVar77 = fVar61 * fVar73 + fVar63 * fVar99;
                  fVar113 = fVar73 * fVar99 + fVar61 * fVar63;
                  fVar70 = fVar73 * fVar99 - fVar61 * fVar63;
                  pfVar3 = (float *)(lVar16 + -0x30 + lVar55);
                  fVar61 = *pfVar3;
                  pfVar4 = (float *)(lVar16 + -0x20 + lVar55);
                  fVar63 = *pfVar4;
                  fVar62 = pfVar4[1];
                  fVar96 = fVar99 * fVar99 + fVar102 + -fVar73 * fVar73;
                  pfVar1 = (float *)(lVar16 + -0x10 + lVar55);
                  fVar73 = *pfVar1;
                  fVar99 = pfVar1[1];
                  fVar102 = pfVar1[2];
                  fVar105 = fVar105 + fVar105;
                  fVar110 = fVar110 + fVar110;
                  pfVar1 = (float *)(lVar16 + lVar55);
                  fVar84 = *pfVar1;
                  fVar93 = pfVar1[1];
                  fVar95 = pfVar1[2];
                  fVar75 = fVar74 * 1.0 + fVar105 * 0.0 + fVar110 * 0.0;
                  fVar76 = fVar74 * 0.0 + fVar105 * 1.0 + fVar110 * 0.0;
                  fVar110 = fVar74 * 0.0 + fVar105 * 0.0 + fVar110 * 1.0;
                  fVar80 = fVar80 + fVar80;
                  fVar113 = fVar113 + fVar113;
                  fVar77 = fVar77 + fVar77;
                  fVar70 = fVar70 + fVar70;
                  fVar74 = fVar80 * 1.0 + fVar111 * 0.0 + fVar113 * 0.0;
                  fVar105 = fVar80 * 0.0 + fVar111 * 1.0 + fVar113 * 0.0;
                  fVar80 = fVar80 * 0.0 + fVar111 * 0.0 + fVar113 * 1.0;
                  fVar111 = fVar77 * 1.0 + fVar70 * 0.0 + fVar96 * 0.0;
                  fVar113 = fVar77 * 0.0 + fVar70 * 1.0 + fVar96 * 0.0;
                  fVar70 = fVar77 * 0.0 + fVar70 * 0.0 + fVar96 * 1.0;
                  fVar88 = fVar61 * fVar75 + fVar74 * 0.0 + fVar111 * 0.0;
                  fVar90 = fVar61 * fVar76 + fVar105 * 0.0 + fVar113 * 0.0;
                  fVar92 = fVar61 * fVar110 + fVar80 * 0.0 + fVar70 * 0.0;
                  fVar77 = fVar63 * fVar75 + fVar62 * fVar74 + fVar111 * 0.0;
                  fVar96 = fVar63 * fVar76 + fVar62 * fVar105 + fVar113 * 0.0;
                  fVar78 = fVar63 * fVar110 + fVar62 * fVar80 + fVar70 * 0.0;
                  fVar97 = fVar73 * fVar75 + fVar99 * fVar74 + fVar102 * fVar111;
                  fVar98 = fVar73 * fVar76 + fVar99 * fVar105 + fVar102 * fVar113;
                  fVar99 = fVar73 * fVar110 + fVar99 * fVar80 + fVar102 * fVar70;
                  fVar102 = fVar84 * fVar75 + fVar93 * fVar74 + fVar95 * fVar111 + pfVar3[1] + 0.0;
                  fVar74 = fVar84 * fVar76 + fVar93 * fVar105 + fVar95 * fVar113 + pfVar3[2] + 0.0;
                  fVar84 = fVar84 * fVar110 + fVar93 * fVar80 + fVar95 * fVar70 + pfVar4[2] + 0.0;
                  fVar62 = fVar88 * fVar104 + fVar90 * fVar103 + fVar92 * local_168;
                  local_208 = fVar88 * fVar106 + fVar90 * fVar109 + fVar92 * fStack_164;
                  fVar63 = fVar88 * fVar107 + fVar90 * fVar112 + fVar92 * fStack_160;
                  fVar61 = fVar97 * fVar104 + fVar98 * fVar103 + fVar99 * local_168;
                  fVar73 = fVar97 * fVar106 + fVar98 * fVar109 + fVar99 * fStack_164;
                  fVar70 = fVar97 * fVar107 + fVar98 * fVar112 + fVar99 * fStack_160;
                  uVar56 = extraout_RDX_08;
                  fVar80 = fVar97 * fVar108 + fVar98 * fVar72 + fVar99 * fStack_15c;
                  fVar99 = fVar88 * fVar108 + fVar90 * fVar72 + fVar92 * fStack_15c;
                  fVar86 = fVar102 * fVar104 + fVar74 * fVar103 + fVar84 * local_168 +
                           fVar79 * fVar87 + fVar7 * fVar81 + fVar8 * fVar86 + local_1f8 + 0.0;
                  fVar100 = fVar102 * fVar106 + fVar74 * fVar109 + fVar84 * fStack_164 +
                            fVar79 * fVar89 + fVar7 * fVar82 + fVar8 * fVar100 + fStack_1f4 + 0.0;
                  fVar101 = fVar102 * fVar107 + fVar74 * fVar112 + fVar84 * fStack_160 +
                            fVar79 * fVar91 + fVar7 * fVar83 + fVar8 * fVar101 + pfVar2[2] + 0.0;
                  fVar79 = fVar102 * fVar108 + fVar74 * fVar72 + fVar84 * fStack_15c +
                           fVar79 * fVar94 + fVar7 * fVar85 + fVar8 * fVar71 + 0.0;
                  fVar102 = fVar77 * fVar104 + fVar96 * fVar103 + fVar78 * local_168;
                  fVar84 = fVar77 * fVar106 + fVar96 * fVar109 + fVar78 * fStack_164;
                  fVar93 = fVar77 * fVar107 + fVar96 * fVar112 + fVar78 * fStack_160;
                  fVar95 = fVar77 * fVar108 + fVar96 * fVar72 + fVar78 * fStack_15c;
                }
                else {
                  bVar44 = bVar12 ^ 1U | bVar44;
                  if (bVar44 == 0) {
                    local_f8 = ZEXT416(*(uint *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc));
                    local_d8 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -0x24));
                    local_c8 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -0x14));
                    local_108 = ZEXT416(*(uint *)((long)pAVar15 + lVar55 + -4));
                    pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x20);
                    local_128 = *pfVar1;
                    fStack_124 = pfVar1[1];
                    fStack_e0 = pfVar1[2];
                    fStack_11c = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x10);
                    local_118 = *pfVar1;
                    fStack_114 = pfVar1[1];
                    fStack_110 = pfVar1[2];
                    fStack_10c = pfVar1[3];
                    pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x30);
                    local_a8 = *pfVar1;
                    fStack_9c = pfVar1[1];
                    pfVar1 = (float *)(lVar16 + -0x30 + lVar55);
                    fVar61 = *pfVar1;
                    fVar73 = pfVar1[1];
                    fVar99 = pfVar1[2];
                    pfVar1 = (float *)(lVar16 + -0x20 + lVar55);
                    fVar102 = *pfVar1;
                    fVar84 = pfVar1[1];
                    fVar93 = pfVar1[2];
                    puVar5 = (undefined8 *)(lVar16 + -0x10 + lVar55);
                    local_138 = *puVar5;
                    uStack_130 = puVar5[1];
                    pfVar1 = (float *)(lVar16 + lVar55);
                    fVar95 = *pfVar1;
                    fVar70 = pfVar1[1];
                    fVar80 = pfVar1[2];
                    fVar62 = fVar61 * local_a8 + fVar73 * local_128 + fVar99 * local_118;
                    fVar86 = fVar61 * 0.0 + fVar73 * fStack_124 + fVar99 * fStack_114;
                    fVar61 = fVar61 * 0.0 + fVar73 * 0.0 + fVar99 * fStack_110;
                    local_168 = fVar102 * local_a8 + fVar84 * local_128 + fVar93 * local_118;
                    fStack_164 = fVar102 * 0.0 + fVar84 * fStack_124 + fVar93 * fStack_114;
                    fStack_160 = fVar102 * 0.0 + fVar84 * 0.0 + fVar93 * fStack_110;
                    fStack_15c = fVar102 * fStack_9c + fVar84 * fStack_11c + fVar93 * fStack_10c;
                    fStack_120 = 0.0;
                    fStack_a4 = 0.0;
                    fStack_a0 = 0.0;
                    pfVar1 = (float *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                    local_b8._0_4_ =
                         fVar95 * local_a8 + fVar70 * local_128 + fVar80 * local_118 + *pfVar1;
                    local_b8._4_4_ =
                         fVar95 * 0.0 + fVar70 * fStack_124 + fVar80 * fStack_114 + pfVar1[1];
                    fStack_b0 = fVar95 * 0.0 + fVar70 * 0.0 + fVar80 * fStack_110 + pfVar1[2];
                    register0x0000128c =
                         fVar95 * fStack_9c + fVar70 * fStack_11c + fVar80 * fStack_10c + pfVar1[3];
                    local_e8 = local_128;
                    fStack_e4 = fStack_124;
                    fStack_dc = fStack_11c;
                    if (((fVar86 != 0.0) || (NAN(fVar86))) ||
                       ((fVar61 != 0.0 ||
                        (((NAN(fVar61) || (fStack_160 != 0.0)) || (NAN(fStack_160))))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply quaternion and general transformation matrix. will ignore lower diagonal"
                                 ,0x61);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      uVar56 = extraout_RDX_10;
                    }
                    fVar61 = local_a8 * (float)local_138 +
                             local_128 * local_138._4_4_ + local_118 * (float)uStack_130;
                    fVar73 = fStack_a4 * (float)local_138 +
                             fStack_124 * local_138._4_4_ + fStack_114 * (float)uStack_130;
                    fVar70 = fStack_a0 * (float)local_138 +
                             fStack_120 * local_138._4_4_ + fStack_110 * (float)uStack_130;
                    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                    fVar80 = (float)local_108._0_4_;
                    fVar99 = (float)local_d8._0_4_;
                    fVar86 = (float)local_b8._0_4_;
                    fVar100 = (float)local_b8._4_4_;
                    fVar101 = fStack_b0;
                    fVar79 = (float)local_f8._0_4_;
                    fVar102 = local_168;
                    fVar84 = fStack_164;
                    fVar93 = fStack_e0;
                    fVar95 = (float)local_c8._0_4_;
                  }
                  else {
                    if (((local_208 != 0.0) || (NAN(local_208))) ||
                       ((fVar63 != 0.0 ||
                        ((NAN(fVar63) ||
                         (uVar9 = *(undefined8 *)((long)pAVar15 + lVar55 + -0x10),
                         auVar31._4_4_ = -(uint)(*(float *)((long)pAVar15 + lVar55 + -0x20) != 0.0),
                         auVar31._0_4_ = -(uint)(*(float *)((long)pAVar15 + lVar55 + -0x18) != 0.0),
                         auVar31._8_4_ = -(uint)((float)uVar9 != 0.0),
                         auVar31._12_4_ = -(uint)((float)((ulong)uVar9 >> 0x20) != 0.0),
                         uVar46 = movmskps((int)CONCAT71(uVar52,bVar44),auVar31),
                         (char)uVar46 != '\0')))))) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 "warning: cannot multiply general transformation matrix and quaternion. will only consider translation and diagonal as scale factors"
                                 ,0x83);
                      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
                      std::ostream::put(-0x38);
                      std::ostream::flush();
                      uVar56 = extraout_RDX_09;
                    }
                    pfVar2 = (float *)(lVar16 + -0x30 + lVar55);
                    pfVar3 = (float *)(lVar16 + -0x20 + lVar55);
                    pfVar4 = (float *)(lVar16 + -0x10 + lVar55);
                    fVar61 = *pfVar4;
                    fVar73 = pfVar4[1];
                    pfVar1 = (float *)(lVar16 + lVar55);
                    uVar9 = *(undefined8 *)((long)&(pAVar15->l).vx.field_0 + lVar55);
                    fVar62 = *(float *)((long)pAVar15 + lVar55 + -0x30) * *pfVar2;
                    local_208 = pfVar2[1] + (float)uVar9;
                    fVar63 = pfVar2[2] + (float)((ulong)uVar9 >> 0x20);
                    fVar70 = pfVar4[2] * *(float *)((long)pAVar15 + lVar55 + -8);
                    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,1);
                    fVar80 = pfVar4[3];
                    fVar99 = pfVar2[3];
                    fVar86 = *pfVar1;
                    fVar100 = pfVar1[1];
                    fVar101 = pfVar1[2];
                    fVar79 = pfVar1[3];
                    fVar102 = *pfVar3;
                    fVar84 = pfVar3[1] * *(float *)((long)pAVar15 + lVar55 + -0x1c);
                    fVar93 = pfVar3[2] + *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 8);
                    fVar95 = pfVar3[3];
                  }
                }
              }
            }
            else {
              pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x24);
              auVar11._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar11._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar11._8_4_ = -(uint)(pfVar1[2] != 1.0);
              auVar11._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar57 = movmskps(uVar57,auVar11);
              if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) ||
                 (((uVar57 & 4) != 0 ||
                  (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53),
                  bVar53 != 0)))) goto LAB_0015dbe6;
              pfVar1 = (float *)((long)pAVar15 + lVar55 + -0x14);
              auVar29._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar29._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar29._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar29._12_4_ = -(uint)(pfVar1[3] != 1.0);
              uVar57 = movmskps(uVar57,auVar29);
              if (((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0))
                 || (bVar53 = ((byte)uVar57 & 8) >> 3, uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53)
                    , bVar53 != 0)) goto LAB_0015dbe6;
              pfVar1 = (float *)((long)pAVar15 + lVar55 + -4);
              auVar30._4_4_ = -(uint)(pfVar1[1] != 0.0);
              auVar30._0_4_ = -(uint)(*pfVar1 != 0.0);
              auVar30._8_4_ = -(uint)(pfVar1[2] != 0.0);
              auVar30._12_4_ = -(uint)(pfVar1[3] != 0.0);
              uVar57 = movmskps(uVar57,auVar30);
              if ((((bVar12 & (byte)uVar57) != 0) || ((uVar57 & 2) != 0)) || ((uVar57 & 4) != 0))
              goto LAB_0015dbe6;
              bVar53 = ((byte)uVar57 & 8) >> 3;
              uVar57 = CONCAT31((int3)(uVar57 >> 8),bVar53);
              uVar56 = (ulong)uVar57;
              if ((bVar53 != 0) ||
                 ((bVar12 != false &&
                  ((fVar61 = *(float *)((long)&(pAVar15->l).vx.field_0 + lVar55 + 0xc),
                   fVar61 != 1.0 || (NAN(fVar61))))))) goto LAB_0015dbe6;
              uStack_1c0 = CONCAT71(uStack_1c0._1_7_,bVar44);
              pfVar1 = (float *)(lVar16 + -0x30 + lVar55);
              fVar62 = *pfVar1;
              local_208 = pfVar1[1];
              fVar63 = pfVar1[2];
              fVar99 = pfVar1[3];
              pfVar1 = (float *)(lVar16 + -0x20 + lVar55);
              fVar102 = *pfVar1;
              fVar84 = pfVar1[1];
              fVar93 = pfVar1[2];
              fVar95 = pfVar1[3];
              pfVar1 = (float *)(lVar16 + -0x10 + lVar55);
              fVar61 = *pfVar1;
              fVar73 = pfVar1[1];
              fVar70 = pfVar1[2];
              fVar80 = pfVar1[3];
              pfVar1 = (float *)(lVar16 + lVar55);
              fVar86 = *pfVar1;
              fVar100 = pfVar1[1];
              fVar101 = pfVar1[2];
              fVar79 = pfVar1[3];
            }
LAB_0015e34b:
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x30);
            *pfVar1 = fVar62;
            pfVar1[1] = local_208;
            pfVar1[2] = fVar63;
            pfVar1[3] = fVar99;
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x20);
            *pfVar1 = fVar102;
            pfVar1[1] = fVar84;
            pfVar1[2] = fVar93;
            pfVar1[3] = fVar95;
            pfVar1 = (float *)((long)local_1c8 + lVar55 + -0x10);
            *pfVar1 = fVar61;
            pfVar1[1] = fVar73;
            pfVar1[2] = fVar70;
            pfVar1[3] = fVar80;
            pfVar1 = (float *)((long)local_1c8 + lVar55);
            *pfVar1 = fVar86;
            pfVar1[1] = fVar100;
            pfVar1[2] = fVar101;
            pfVar1[3] = fVar79;
            uVar54 = uVar54 + 1;
            lVar55 = lVar55 + 0x40;
            pvVar49 = local_1c8;
          } while (uVar54 < (spaces->spaces).size_active);
        }
        goto LAB_0015e81a;
      }
    }
    local_1c8 = (void *)0x0;
    local_1d8._8_8_ = 0;
    local_1d8._M_allocated_capacity = 0;
    uVar45 = 1;
    if (spaces->quaternion == false) {
      uVar45 = (undefined1)(int)plVar47[0x12];
    }
    uStack_1c0 = CONCAT71(uStack_1c0._1_7_,uVar45);
    local_150 = (vector<embree::Ref<embree::SceneGraph::Node>,std::allocator<embree::Ref<embree::SceneGraph::Node>>>
                 *)group;
  }
LAB_0015e81a:
  convertLightsAndCameras
            (local_148,
             (vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
              *)local_150,(Ref<embree::SceneGraph::Node> *)(plVar47 + 0x13),
             (Transformations *)&local_1e8.field_1);
  alignedFree(local_1c8);
  (**(code **)(*plVar47 + 0x18))(plVar47);
  return;
}

Assistant:

void convertLightsAndCameras(std::vector<Ref<SceneGraph::Node>>& group, const Ref<SceneGraph::Node>& node, const SceneGraph::Transformations& spaces)
    {
      if (!node->hasLightOrCamera) return;
      
      if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
        convertLightsAndCameras(group,xfmNode->child, spaces*xfmNode->spaces);
      } 
      else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) {
        for (const auto& child : groupNode->children) convertLightsAndCameras(group,child,spaces);
      }
      else if (Ref<SceneGraph::AnimatedLightNode> lightNode = node.dynamicCast<SceneGraph::AnimatedLightNode>()) {
        if (spaces.size() != 1) throw std::runtime_error("animated lights cannot get instantiated with a transform animation");
        group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
      }
      else if (Ref<SceneGraph::LightNode> lightNode = node.dynamicCast<SceneGraph::LightNode>())
      {
        if (spaces.size() == 1)
          group.push_back(lightNode->transform(spaces[0]).dynamicCast<SceneGraph::Node>());
        else
        {
          std::vector<Ref<SceneGraph::LightNode>> lights(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            lights[i] = lightNode->transform(spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedLightNode(std::move(lights),spaces.time_range));
        }
      }
      else if (Ref<SceneGraph::AnimatedPerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::AnimatedPerspectiveCameraNode>())
      {
        if (spaces.size() != 1) throw std::runtime_error("animated cameras cannot get instantiated with a transform animation");
        group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
      }
      else if (Ref<SceneGraph::PerspectiveCameraNode> cameraNode = node.dynamicCast<SceneGraph::PerspectiveCameraNode>())
      {
        if (spaces.size() == 1)
          group.push_back(new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[0],makeUniqueID(cameraNode->name)));
        else
        {
          std::vector<Ref<SceneGraph::PerspectiveCameraNode>> cameras(spaces.size());
          for (size_t i=0; i<spaces.size(); i++)
            cameras[i] = new SceneGraph::PerspectiveCameraNode(cameraNode,spaces[i]);
          
          group.push_back(new SceneGraph::AnimatedPerspectiveCameraNode(std::move(cameras),spaces.time_range,makeUniqueID(cameraNode->name)));
        }
      }
    }